

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<8,8>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx512::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [16];
  undefined1 (*pauVar6) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar14;
  int iVar15;
  Geometry *pGVar16;
  RTCFilterFunctionN p_Var17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined8 uVar72;
  undefined8 uVar73;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  byte bVar76;
  Geometry *geometry;
  long lVar77;
  ulong uVar78;
  ulong uVar79;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  bool bVar80;
  ulong uVar81;
  undefined8 unaff_R13;
  long lVar82;
  ulong uVar83;
  byte bVar84;
  float fVar85;
  float fVar131;
  float fVar133;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar89 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar90 [16];
  float fVar132;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar137;
  float fVar138;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar139;
  undefined4 uVar140;
  float fVar144;
  undefined8 uVar141;
  float fVar145;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar146;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  float fVar153;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar176 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  uint uVar180;
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  RTCFilterFunctionNArguments args;
  RTCFilterFunctionNArguments local_650;
  undefined1 local_620 [32];
  float local_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  LinearSpace3fa *local_530;
  ulong local_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  uint local_440;
  uint uStack_43c;
  uint uStack_438;
  uint uStack_434;
  uint uStack_430;
  uint uStack_42c;
  uint uStack_428;
  uint uStack_424;
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined4 local_380;
  int local_37c;
  undefined1 local_370 [16];
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  float local_320 [4];
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  uVar83 = (ulong)(byte)prim[1];
  fVar146 = *(float *)(prim + uVar83 * 0x19 + 0x12);
  auVar26 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar26 = vinsertps_avx(auVar26,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar88 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar142 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar150 = vsubps_avx(auVar26,*(undefined1 (*) [16])(prim + uVar83 * 0x19 + 6));
  fVar153 = fVar146 * auVar150._0_4_;
  fVar139 = fVar146 * auVar142._0_4_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar83 * 4 + 6);
  auVar99 = vpmovsxbd_avx2(auVar26);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar83 * 5 + 6);
  auVar95 = vpmovsxbd_avx2(auVar88);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar83 * 6 + 6);
  auVar96 = vpmovsxbd_avx2(auVar87);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar83 * 0xb + 6);
  auVar97 = vpmovsxbd_avx2(auVar9);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar83 * 0xc + 6);
  auVar98 = vpmovsxbd_avx2(auVar10);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar83 * 0xd + 6);
  auVar100 = vpmovsxbd_avx2(auVar11);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar83 * 0x12 + 6);
  auVar101 = vpmovsxbd_avx2(auVar12);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar83 * 0x13 + 6);
  auVar108 = vpmovsxbd_avx2(auVar13);
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar83 * 0x14 + 6);
  auVar102 = vpmovsxbd_avx2(auVar86);
  auVar109 = vcvtdq2ps_avx(auVar102);
  auVar184._4_4_ = fVar139;
  auVar184._0_4_ = fVar139;
  auVar184._8_4_ = fVar139;
  auVar184._12_4_ = fVar139;
  auVar184._16_4_ = fVar139;
  auVar184._20_4_ = fVar139;
  auVar184._24_4_ = fVar139;
  auVar184._28_4_ = fVar139;
  auVar186._8_4_ = 1;
  auVar186._0_8_ = 0x100000001;
  auVar186._12_4_ = 1;
  auVar186._16_4_ = 1;
  auVar186._20_4_ = 1;
  auVar186._24_4_ = 1;
  auVar186._28_4_ = 1;
  auVar91 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar94 = ZEXT1632(CONCAT412(fVar146 * auVar142._12_4_,
                               CONCAT48(fVar146 * auVar142._8_4_,
                                        CONCAT44(fVar146 * auVar142._4_4_,fVar139))));
  auVar93 = vpermps_avx2(auVar186,auVar94);
  auVar92 = vpermps_avx512vl(auVar91,auVar94);
  fVar139 = auVar92._0_4_;
  auVar195._0_4_ = fVar139 * auVar96._0_4_;
  fVar144 = auVar92._4_4_;
  auVar195._4_4_ = fVar144 * auVar96._4_4_;
  fVar145 = auVar92._8_4_;
  auVar195._8_4_ = fVar145 * auVar96._8_4_;
  fVar174 = auVar92._12_4_;
  auVar195._12_4_ = fVar174 * auVar96._12_4_;
  fVar173 = auVar92._16_4_;
  auVar195._16_4_ = fVar173 * auVar96._16_4_;
  fVar175 = auVar92._20_4_;
  auVar195._20_4_ = fVar175 * auVar96._20_4_;
  fVar85 = auVar92._24_4_;
  auVar195._28_36_ = in_ZMM4._28_36_;
  auVar195._24_4_ = fVar85 * auVar96._24_4_;
  auVar94._4_4_ = auVar100._4_4_ * fVar144;
  auVar94._0_4_ = auVar100._0_4_ * fVar139;
  auVar94._8_4_ = auVar100._8_4_ * fVar145;
  auVar94._12_4_ = auVar100._12_4_ * fVar174;
  auVar94._16_4_ = auVar100._16_4_ * fVar173;
  auVar94._20_4_ = auVar100._20_4_ * fVar175;
  auVar94._24_4_ = auVar100._24_4_ * fVar85;
  auVar94._28_4_ = auVar102._28_4_;
  auVar102._4_4_ = auVar109._4_4_ * fVar144;
  auVar102._0_4_ = auVar109._0_4_ * fVar139;
  auVar102._8_4_ = auVar109._8_4_ * fVar145;
  auVar102._12_4_ = auVar109._12_4_ * fVar174;
  auVar102._16_4_ = auVar109._16_4_ * fVar173;
  auVar102._20_4_ = auVar109._20_4_ * fVar175;
  auVar102._24_4_ = auVar109._24_4_ * fVar85;
  auVar102._28_4_ = auVar92._28_4_;
  auVar26 = vfmadd231ps_fma(auVar195._0_32_,auVar93,auVar95);
  auVar88 = vfmadd231ps_fma(auVar94,auVar93,auVar98);
  auVar87 = vfmadd231ps_fma(auVar102,auVar108,auVar93);
  auVar26 = vfmadd231ps_fma(ZEXT1632(auVar26),auVar184,auVar99);
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar184,auVar97);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar101,auVar184);
  auVar185._4_4_ = fVar153;
  auVar185._0_4_ = fVar153;
  auVar185._8_4_ = fVar153;
  auVar185._12_4_ = fVar153;
  auVar185._16_4_ = fVar153;
  auVar185._20_4_ = fVar153;
  auVar185._24_4_ = fVar153;
  auVar185._28_4_ = fVar153;
  auVar93 = ZEXT1632(CONCAT412(fVar146 * auVar150._12_4_,
                               CONCAT48(fVar146 * auVar150._8_4_,
                                        CONCAT44(fVar146 * auVar150._4_4_,fVar153))));
  auVar102 = vpermps_avx2(auVar186,auVar93);
  auVar93 = vpermps_avx512vl(auVar91,auVar93);
  auVar94 = vmulps_avx512vl(auVar93,auVar96);
  auVar104._0_4_ = auVar93._0_4_ * auVar100._0_4_;
  auVar104._4_4_ = auVar93._4_4_ * auVar100._4_4_;
  auVar104._8_4_ = auVar93._8_4_ * auVar100._8_4_;
  auVar104._12_4_ = auVar93._12_4_ * auVar100._12_4_;
  auVar104._16_4_ = auVar93._16_4_ * auVar100._16_4_;
  auVar104._20_4_ = auVar93._20_4_ * auVar100._20_4_;
  auVar104._24_4_ = auVar93._24_4_ * auVar100._24_4_;
  auVar104._28_4_ = 0;
  auVar100._4_4_ = auVar93._4_4_ * auVar109._4_4_;
  auVar100._0_4_ = auVar93._0_4_ * auVar109._0_4_;
  auVar100._8_4_ = auVar93._8_4_ * auVar109._8_4_;
  auVar100._12_4_ = auVar93._12_4_ * auVar109._12_4_;
  auVar100._16_4_ = auVar93._16_4_ * auVar109._16_4_;
  auVar100._20_4_ = auVar93._20_4_ * auVar109._20_4_;
  auVar100._24_4_ = auVar93._24_4_ * auVar109._24_4_;
  auVar100._28_4_ = auVar96._28_4_;
  auVar95 = vfmadd231ps_avx512vl(auVar94,auVar102,auVar95);
  auVar9 = vfmadd231ps_fma(auVar104,auVar102,auVar98);
  auVar10 = vfmadd231ps_fma(auVar100,auVar102,auVar108);
  auVar95 = vfmadd231ps_avx512vl(auVar95,auVar185,auVar99);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar185,auVar97);
  auVar107._8_4_ = 0x7fffffff;
  auVar107._0_8_ = 0x7fffffff7fffffff;
  auVar107._12_4_ = 0x7fffffff;
  auVar107._16_4_ = 0x7fffffff;
  auVar107._20_4_ = 0x7fffffff;
  auVar107._24_4_ = 0x7fffffff;
  auVar107._28_4_ = 0x7fffffff;
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar185,auVar101);
  auVar99 = vandps_avx(ZEXT1632(auVar26),auVar107);
  auVar106._8_4_ = 0x219392ef;
  auVar106._0_8_ = 0x219392ef219392ef;
  auVar106._12_4_ = 0x219392ef;
  auVar106._16_4_ = 0x219392ef;
  auVar106._20_4_ = 0x219392ef;
  auVar106._24_4_ = 0x219392ef;
  auVar106._28_4_ = 0x219392ef;
  uVar79 = vcmpps_avx512vl(auVar99,auVar106,1);
  bVar80 = (bool)((byte)uVar79 & 1);
  auVar93._0_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar26._0_4_;
  bVar80 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar26._4_4_;
  bVar80 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar26._8_4_;
  bVar80 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar26._12_4_;
  auVar93._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar93._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar93._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar93._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar99 = vandps_avx(ZEXT1632(auVar88),auVar107);
  uVar79 = vcmpps_avx512vl(auVar99,auVar106,1);
  bVar80 = (bool)((byte)uVar79 & 1);
  auVar91._0_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar88._0_4_;
  bVar80 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar88._4_4_;
  bVar80 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar88._8_4_;
  bVar80 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar88._12_4_;
  auVar91._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar91._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar91._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar91._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar99 = vandps_avx(ZEXT1632(auVar87),auVar107);
  uVar79 = vcmpps_avx512vl(auVar99,auVar106,1);
  bVar80 = (bool)((byte)uVar79 & 1);
  auVar99._0_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar87._0_4_;
  bVar80 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar87._4_4_;
  bVar80 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar87._8_4_;
  bVar80 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar87._12_4_;
  auVar99._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar99._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar99._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar99._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar96 = vrcp14ps_avx512vl(auVar93);
  auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar98 = vfnmadd213ps_avx512vl(auVar93,auVar96,auVar97);
  auVar26 = vfmadd132ps_fma(auVar98,auVar96,auVar96);
  auVar96 = vrcp14ps_avx512vl(auVar91);
  auVar98 = vfnmadd213ps_avx512vl(auVar91,auVar96,auVar97);
  auVar88 = vfmadd132ps_fma(auVar98,auVar96,auVar96);
  auVar96 = vrcp14ps_avx512vl(auVar99);
  auVar99 = vfnmadd213ps_avx512vl(auVar99,auVar96,auVar97);
  auVar87 = vfmadd132ps_fma(auVar99,auVar96,auVar96);
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 7 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx512vl(auVar99,auVar95);
  auVar101._4_4_ = auVar26._4_4_ * auVar99._4_4_;
  auVar101._0_4_ = auVar26._0_4_ * auVar99._0_4_;
  auVar101._8_4_ = auVar26._8_4_ * auVar99._8_4_;
  auVar101._12_4_ = auVar26._12_4_ * auVar99._12_4_;
  auVar101._16_4_ = auVar99._16_4_ * 0.0;
  auVar101._20_4_ = auVar99._20_4_ * 0.0;
  auVar101._24_4_ = auVar99._24_4_ * 0.0;
  auVar101._28_4_ = auVar99._28_4_;
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 9 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx512vl(auVar99,auVar95);
  auVar105._0_4_ = auVar26._0_4_ * auVar99._0_4_;
  auVar105._4_4_ = auVar26._4_4_ * auVar99._4_4_;
  auVar105._8_4_ = auVar26._8_4_ * auVar99._8_4_;
  auVar105._12_4_ = auVar26._12_4_ * auVar99._12_4_;
  auVar105._16_4_ = auVar99._16_4_ * 0.0;
  auVar105._20_4_ = auVar99._20_4_ * 0.0;
  auVar105._24_4_ = auVar99._24_4_ * 0.0;
  auVar105._28_4_ = 0;
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 0xe + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar9));
  auVar108._4_4_ = auVar88._4_4_ * auVar99._4_4_;
  auVar108._0_4_ = auVar88._0_4_ * auVar99._0_4_;
  auVar108._8_4_ = auVar88._8_4_ * auVar99._8_4_;
  auVar108._12_4_ = auVar88._12_4_ * auVar99._12_4_;
  auVar108._16_4_ = auVar99._16_4_ * 0.0;
  auVar108._20_4_ = auVar99._20_4_ * 0.0;
  auVar108._24_4_ = auVar99._24_4_ * 0.0;
  auVar108._28_4_ = auVar99._28_4_;
  auVar100 = vpbroadcastd_avx512vl();
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar9));
  auVar103._0_4_ = auVar88._0_4_ * auVar99._0_4_;
  auVar103._4_4_ = auVar88._4_4_ * auVar99._4_4_;
  auVar103._8_4_ = auVar88._8_4_ * auVar99._8_4_;
  auVar103._12_4_ = auVar88._12_4_ * auVar99._12_4_;
  auVar103._16_4_ = auVar99._16_4_ * 0.0;
  auVar103._20_4_ = auVar99._20_4_ * 0.0;
  auVar103._24_4_ = auVar99._24_4_ * 0.0;
  auVar103._28_4_ = 0;
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 0x15 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar10));
  auVar109._4_4_ = auVar99._4_4_ * auVar87._4_4_;
  auVar109._0_4_ = auVar99._0_4_ * auVar87._0_4_;
  auVar109._8_4_ = auVar99._8_4_ * auVar87._8_4_;
  auVar109._12_4_ = auVar99._12_4_ * auVar87._12_4_;
  auVar109._16_4_ = auVar99._16_4_ * 0.0;
  auVar109._20_4_ = auVar99._20_4_ * 0.0;
  auVar109._24_4_ = auVar99._24_4_ * 0.0;
  auVar109._28_4_ = auVar99._28_4_;
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 0x17 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar10));
  auVar92._0_4_ = auVar87._0_4_ * auVar99._0_4_;
  auVar92._4_4_ = auVar87._4_4_ * auVar99._4_4_;
  auVar92._8_4_ = auVar87._8_4_ * auVar99._8_4_;
  auVar92._12_4_ = auVar87._12_4_ * auVar99._12_4_;
  auVar92._16_4_ = auVar99._16_4_ * 0.0;
  auVar92._20_4_ = auVar99._20_4_ * 0.0;
  auVar92._24_4_ = auVar99._24_4_ * 0.0;
  auVar92._28_4_ = 0;
  auVar99 = vpminsd_avx2(auVar101,auVar105);
  auVar95 = vpminsd_avx2(auVar108,auVar103);
  auVar99 = vmaxps_avx(auVar99,auVar95);
  auVar95 = vpminsd_avx2(auVar109,auVar92);
  uVar140 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar96._4_4_ = uVar140;
  auVar96._0_4_ = uVar140;
  auVar96._8_4_ = uVar140;
  auVar96._12_4_ = uVar140;
  auVar96._16_4_ = uVar140;
  auVar96._20_4_ = uVar140;
  auVar96._24_4_ = uVar140;
  auVar96._28_4_ = uVar140;
  auVar95 = vmaxps_avx512vl(auVar95,auVar96);
  auVar99 = vmaxps_avx(auVar99,auVar95);
  auVar95._8_4_ = 0x3f7ffffa;
  auVar95._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar95._12_4_ = 0x3f7ffffa;
  auVar95._16_4_ = 0x3f7ffffa;
  auVar95._20_4_ = 0x3f7ffffa;
  auVar95._24_4_ = 0x3f7ffffa;
  auVar95._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar99,auVar95);
  auVar99 = vpmaxsd_avx2(auVar101,auVar105);
  auVar95 = vpmaxsd_avx2(auVar108,auVar103);
  auVar99 = vminps_avx(auVar99,auVar95);
  auVar95 = vpmaxsd_avx2(auVar109,auVar92);
  uVar140 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar97._4_4_ = uVar140;
  auVar97._0_4_ = uVar140;
  auVar97._8_4_ = uVar140;
  auVar97._12_4_ = uVar140;
  auVar97._16_4_ = uVar140;
  auVar97._20_4_ = uVar140;
  auVar97._24_4_ = uVar140;
  auVar97._28_4_ = uVar140;
  auVar95 = vminps_avx512vl(auVar95,auVar97);
  auVar99 = vminps_avx(auVar99,auVar95);
  auVar98._8_4_ = 0x3f800003;
  auVar98._0_8_ = 0x3f8000033f800003;
  auVar98._12_4_ = 0x3f800003;
  auVar98._16_4_ = 0x3f800003;
  auVar98._20_4_ = 0x3f800003;
  auVar98._24_4_ = 0x3f800003;
  auVar98._28_4_ = 0x3f800003;
  auVar99 = vmulps_avx512vl(auVar99,auVar98);
  uVar27 = vcmpps_avx512vl(local_80,auVar99,2);
  uVar29 = vpcmpgtd_avx512vl(auVar100,_DAT_01fb4ba0);
  local_528 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)(byte)((byte)uVar27 & (byte)uVar29));
  local_530 = pre->ray_space + k;
  local_2c0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  while (auVar99 = local_420, local_528 != 0) {
    lVar82 = 0;
    for (uVar79 = local_528; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
      lVar82 = lVar82 + 1;
    }
    uVar14 = *(uint *)(prim + 2);
    pGVar16 = (context->scene->geometries).items[uVar14].ptr;
    uVar79 = (ulong)*(uint *)(*(long *)&pGVar16->field_0x58 +
                             pGVar16[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i * (ulong)*(uint *)(prim + lVar82 * 4 + 6));
    p_Var17 = pGVar16[1].intersectionFilterN;
    lVar82 = *(long *)&pGVar16[1].time_range.upper;
    auVar26 = *(undefined1 (*) [16])(lVar82 + (long)p_Var17 * uVar79);
    pauVar4 = (undefined1 (*) [16])(lVar82 + (uVar79 + 1) * (long)p_Var17);
    uVar27 = *(undefined8 *)*pauVar4;
    uVar29 = *(undefined8 *)(*pauVar4 + 8);
    auVar12 = *pauVar4;
    auVar10 = *pauVar4;
    auVar88 = *pauVar4;
    pauVar5 = (undefined1 (*) [16])(lVar82 + (uVar79 + 2) * (long)p_Var17);
    uVar72 = *(undefined8 *)*pauVar5;
    uVar73 = *(undefined8 *)(*pauVar5 + 8);
    auVar11 = *pauVar5;
    auVar9 = *pauVar5;
    auVar87 = *pauVar5;
    uVar83 = local_528 - 1 & local_528;
    pauVar6 = (undefined1 (*) [12])(lVar82 + (uVar79 + 3) * (long)p_Var17);
    local_5f0 = (float)*(undefined8 *)*pauVar6;
    fStack_5ec = (float)((ulong)*(undefined8 *)*pauVar6 >> 0x20);
    fStack_5e8 = (float)*(undefined8 *)(*pauVar6 + 8);
    fStack_5e4 = (float)((ulong)*(undefined8 *)(*pauVar6 + 8) >> 0x20);
    if (uVar83 != 0) {
      uVar81 = uVar83 - 1 & uVar83;
      for (uVar79 = uVar83; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
      }
      if (uVar81 != 0) {
        for (; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
        }
      }
    }
    iVar15 = (int)pGVar16[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                            0x1c);
    auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar142 = vsubps_avx(auVar26,auVar13);
    uVar140 = auVar142._0_4_;
    auVar150._4_4_ = uVar140;
    auVar150._0_4_ = uVar140;
    auVar150._8_4_ = uVar140;
    auVar150._12_4_ = uVar140;
    auVar86 = vshufps_avx(auVar142,auVar142,0x55);
    auVar142 = vshufps_avx(auVar142,auVar142,0xaa);
    aVar7 = (local_530->vx).field_0;
    aVar8 = (local_530->vy).field_0;
    fVar146 = (local_530->vz).field_0.m128[0];
    fVar139 = *(float *)((long)&(local_530->vz).field_0 + 4);
    fVar144 = *(float *)((long)&(local_530->vz).field_0 + 8);
    fVar145 = *(float *)((long)&(local_530->vz).field_0 + 0xc);
    auVar177._0_4_ = fVar146 * auVar142._0_4_;
    auVar177._4_4_ = fVar139 * auVar142._4_4_;
    auVar177._8_4_ = fVar144 * auVar142._8_4_;
    auVar177._12_4_ = fVar145 * auVar142._12_4_;
    auVar86 = vfmadd231ps_fma(auVar177,(undefined1  [16])aVar8,auVar86);
    auVar177 = vfmadd231ps_fma(auVar86,(undefined1  [16])aVar7,auVar150);
    auVar86 = vshufps_avx(auVar26,auVar26,0xff);
    auVar150 = vsubps_avx(auVar88,auVar13);
    uVar140 = auVar150._0_4_;
    auVar154._4_4_ = uVar140;
    auVar154._0_4_ = uVar140;
    auVar154._8_4_ = uVar140;
    auVar154._12_4_ = uVar140;
    auVar142 = vshufps_avx(auVar150,auVar150,0x55);
    auVar150 = vshufps_avx(auVar150,auVar150,0xaa);
    auVar178._0_4_ = fVar146 * auVar150._0_4_;
    auVar178._4_4_ = fVar139 * auVar150._4_4_;
    auVar178._8_4_ = fVar144 * auVar150._8_4_;
    auVar178._12_4_ = fVar145 * auVar150._12_4_;
    auVar142 = vfmadd231ps_fma(auVar178,(undefined1  [16])aVar8,auVar142);
    auVar154 = vfmadd231ps_fma(auVar142,(undefined1  [16])aVar7,auVar154);
    auVar88 = vshufps_avx(auVar88,auVar88,0xff);
    auVar150 = vsubps_avx(auVar87,auVar13);
    uVar140 = auVar150._0_4_;
    auVar90._4_4_ = uVar140;
    auVar90._0_4_ = uVar140;
    auVar90._8_4_ = uVar140;
    auVar90._12_4_ = uVar140;
    auVar142 = vshufps_avx(auVar150,auVar150,0x55);
    auVar150 = vshufps_avx(auVar150,auVar150,0xaa);
    auVar181._0_4_ = fVar146 * auVar150._0_4_;
    auVar181._4_4_ = fVar139 * auVar150._4_4_;
    auVar181._8_4_ = fVar144 * auVar150._8_4_;
    auVar181._12_4_ = fVar145 * auVar150._12_4_;
    auVar142 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar8,auVar142);
    auVar150 = vfmadd231ps_fma(auVar142,(undefined1  [16])aVar7,auVar90);
    auVar87 = vshufps_avx(auVar87,auVar87,0xff);
    auVar89._12_4_ = fStack_5e4;
    auVar89._0_12_ = *pauVar6;
    auVar142 = vsubps_avx(auVar89,auVar13);
    uVar140 = auVar142._0_4_;
    auVar155._4_4_ = uVar140;
    auVar155._0_4_ = uVar140;
    auVar155._8_4_ = uVar140;
    auVar155._12_4_ = uVar140;
    auVar13 = vshufps_avx(auVar142,auVar142,0x55);
    auVar142 = vshufps_avx(auVar142,auVar142,0xaa);
    auVar183._0_4_ = fVar146 * auVar142._0_4_;
    auVar183._4_4_ = fVar139 * auVar142._4_4_;
    auVar183._8_4_ = fVar144 * auVar142._8_4_;
    auVar183._12_4_ = fVar145 * auVar142._12_4_;
    auVar13 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar8,auVar13);
    auVar142 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar7,auVar155);
    auVar13 = vshufps_avx(auVar89,auVar89,0xff);
    lVar82 = (long)iVar15 * 0x44;
    auVar95 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar82);
    local_4a0 = vbroadcastss_avx512vl(auVar177);
    auVar160._8_4_ = 1;
    auVar160._0_8_ = 0x100000001;
    auVar160._12_4_ = 1;
    auVar160._16_4_ = 1;
    auVar160._20_4_ = 1;
    auVar160._24_4_ = 1;
    auVar160._28_4_ = 1;
    local_4c0 = vpermps_avx512vl(auVar160,ZEXT1632(auVar177));
    uVar141 = auVar86._0_8_;
    local_a0._8_8_ = uVar141;
    local_a0._0_8_ = uVar141;
    local_a0._16_8_ = uVar141;
    local_a0._24_8_ = uVar141;
    auVar96 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar82 + 0x484);
    uVar140 = auVar154._0_4_;
    local_500._4_4_ = uVar140;
    local_500._0_4_ = uVar140;
    local_500._8_4_ = uVar140;
    local_500._12_4_ = uVar140;
    local_500._16_4_ = uVar140;
    local_500._20_4_ = uVar140;
    local_500._24_4_ = uVar140;
    local_500._28_4_ = uVar140;
    local_4e0 = vpermps_avx512vl(auVar160,ZEXT1632(auVar154));
    local_c0 = vbroadcastsd_avx512vl(auVar88);
    auVar97 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar82 + 0x908);
    uVar140 = auVar150._0_4_;
    auVar151._4_4_ = uVar140;
    auVar151._0_4_ = uVar140;
    auVar151._8_4_ = uVar140;
    auVar151._12_4_ = uVar140;
    local_620._16_4_ = uVar140;
    local_620._0_16_ = auVar151;
    local_620._20_4_ = uVar140;
    local_620._24_4_ = uVar140;
    local_620._28_4_ = uVar140;
    local_5a0 = vpermps_avx512vl(auVar160,ZEXT1632(auVar150));
    local_e0 = vbroadcastsd_avx512vl(auVar87);
    auVar98 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar82 + 0xd8c);
    local_5c0 = vbroadcastss_avx512vl(auVar142);
    auVar195 = ZEXT3264(local_5c0);
    local_5e0 = vpermps_avx512vl(auVar160,ZEXT1632(auVar142));
    auVar196 = ZEXT3264(local_5e0);
    uVar141 = auVar13._0_8_;
    register0x000012c8 = uVar141;
    local_100 = uVar141;
    register0x000012d0 = uVar141;
    register0x000012d8 = uVar141;
    auVar100 = vmulps_avx512vl(local_5c0,auVar98);
    auVar101 = vmulps_avx512vl(local_5e0,auVar98);
    auVar88 = vfmadd231ps_fma(auVar100,auVar97,local_620);
    auVar100 = vfmadd231ps_avx512vl(auVar101,auVar97,local_5a0);
    auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar96,local_500);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar96,local_4e0);
    auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar95,local_4a0);
    auVar93 = vfmadd231ps_avx512vl(auVar100,auVar95,local_4c0);
    auVar100 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar82);
    auVar101 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar82 + 0x484);
    auVar108 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar82 + 0x908);
    auVar109 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar82 + 0xd8c);
    auVar94 = vmulps_avx512vl(local_5c0,auVar109);
    auVar91 = vmulps_avx512vl(local_5e0,auVar109);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar108,local_620);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar108,local_5a0);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar101,local_500);
    auVar198 = ZEXT3264(local_4e0);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar101,local_4e0);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar100,local_4a0);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar100,local_4c0);
    auVar92 = vsubps_avx512vl(auVar94,auVar102);
    auVar103 = vsubps_avx512vl(auVar91,auVar93);
    auVar104 = vmulps_avx512vl(auVar93,auVar92);
    auVar105 = vmulps_avx512vl(auVar102,auVar103);
    auVar104 = vsubps_avx512vl(auVar104,auVar105);
    auVar105 = vmulps_avx512vl(_local_100,auVar98);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar97,local_e0);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar96,local_c0);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar95,local_a0);
    auVar106 = vmulps_avx512vl(_local_100,auVar109);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar108,local_e0);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar101,local_c0);
    auVar13 = vfmadd231ps_fma(auVar106,auVar100,local_a0);
    auVar106 = vmulps_avx512vl(auVar103,auVar103);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar92,auVar92);
    auVar107 = vmaxps_avx512vl(auVar105,ZEXT1632(auVar13));
    auVar107 = vmulps_avx512vl(auVar107,auVar107);
    auVar106 = vmulps_avx512vl(auVar107,auVar106);
    auVar104 = vmulps_avx512vl(auVar104,auVar104);
    uVar141 = vcmpps_avx512vl(auVar104,auVar106,2);
    auVar88 = vblendps_avx(auVar177,auVar26,8);
    auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar87 = vandps_avx512vl(auVar88,auVar86);
    auVar88 = vblendps_avx(auVar154,*pauVar4,8);
    auVar88 = vandps_avx512vl(auVar88,auVar86);
    auVar87 = vmaxps_avx(auVar87,auVar88);
    auVar88 = vblendps_avx(auVar150,*pauVar5,8);
    auVar89 = vandps_avx512vl(auVar88,auVar86);
    auVar30._12_4_ = fStack_5e4;
    auVar30._0_12_ = *pauVar6;
    auVar88 = vblendps_avx(auVar142,auVar30,8);
    auVar88 = vandps_avx512vl(auVar88,auVar86);
    auVar88 = vmaxps_avx(auVar89,auVar88);
    auVar88 = vmaxps_avx(auVar87,auVar88);
    auVar87 = vmovshdup_avx(auVar88);
    auVar87 = vmaxss_avx(auVar87,auVar88);
    auVar88 = vshufpd_avx(auVar88,auVar88,1);
    local_420._0_4_ = (undefined4)iVar15;
    local_420._4_12_ = auVar177._4_12_;
    auVar88 = vmaxss_avx(auVar88,auVar87);
    local_420._16_16_ = auVar99._16_16_;
    auVar182._4_4_ = local_420._0_4_;
    auVar182._0_4_ = local_420._0_4_;
    auVar182._8_4_ = local_420._0_4_;
    auVar182._12_4_ = local_420._0_4_;
    auVar182._16_4_ = local_420._0_4_;
    auVar182._20_4_ = local_420._0_4_;
    auVar182._24_4_ = local_420._0_4_;
    auVar182._28_4_ = local_420._0_4_;
    uVar28 = vcmpps_avx512vl(auVar182,_DAT_01f7b060,0xe);
    bVar84 = (byte)uVar141 & (byte)uVar28;
    fVar146 = auVar88._0_4_ * 4.7683716e-07;
    auVar161._8_4_ = 2;
    auVar161._0_8_ = 0x200000002;
    auVar161._12_4_ = 2;
    auVar161._16_4_ = 2;
    auVar161._20_4_ = 2;
    auVar161._24_4_ = 2;
    auVar161._28_4_ = 2;
    local_120 = vpermps_avx512vl(auVar161,ZEXT1632(auVar177));
    local_140 = vpermps_avx512vl(auVar161,ZEXT1632(auVar154));
    local_160 = vpermps_avx512vl(auVar161,ZEXT1632(auVar150));
    local_580 = vpermps_avx2(auVar161,ZEXT1632(auVar142));
    uVar180 = *(uint *)(ray + k * 4 + 0x60);
    local_2a0 = vpbroadcastd_avx512vl();
    if (bVar84 == 0) {
      bVar80 = false;
      auVar88 = vxorps_avx512vl(auVar109._0_16_,auVar109._0_16_);
      auVar190 = ZEXT1664(auVar88);
      auVar191 = ZEXT3264(local_4a0);
      auVar192 = ZEXT3264(local_4c0);
      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar197 = ZEXT3264(auVar99);
      auVar193 = ZEXT3264(local_500);
      auVar189 = ZEXT3264(local_620);
      auVar194 = ZEXT3264(local_5a0);
    }
    else {
      local_520._0_16_ = ZEXT416(uVar180);
      auVar99 = vmulps_avx512vl(local_580,auVar109);
      auVar99 = vfmadd213ps_avx512vl(auVar108,local_160,auVar99);
      auVar99 = vfmadd213ps_avx512vl(auVar101,local_140,auVar99);
      auVar100 = vfmadd213ps_avx512vl(auVar100,local_120,auVar99);
      auVar99 = vmulps_avx512vl(local_580,auVar98);
      auVar99 = vfmadd213ps_avx512vl(auVar97,local_160,auVar99);
      auVar101 = vfmadd213ps_avx512vl(auVar96,local_140,auVar99);
      auVar99 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar82 + 0x1210);
      auVar96 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar82 + 0x1694);
      auVar97 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar82 + 0x1b18);
      auVar98 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar82 + 0x1f9c);
      auVar101 = vfmadd213ps_avx512vl(auVar95,local_120,auVar101);
      auVar95 = vmulps_avx512vl(local_5c0,auVar98);
      auVar108 = vmulps_avx512vl(local_5e0,auVar98);
      auVar98 = vmulps_avx512vl(local_580,auVar98);
      auVar88 = vfmadd231ps_fma(auVar95,auVar97,local_620);
      auVar95 = vfmadd231ps_avx512vl(auVar108,auVar97,local_5a0);
      auVar97 = vfmadd231ps_avx512vl(auVar98,local_160,auVar97);
      auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar96,local_500);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar96,local_4e0);
      auVar108 = vfmadd231ps_avx512vl(auVar97,local_140,auVar96);
      auVar88 = vfmadd231ps_fma(auVar98,auVar99,local_4a0);
      auVar98 = vfmadd231ps_avx512vl(auVar95,auVar99,local_4c0);
      auVar95 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar82 + 0x1210);
      auVar96 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar82 + 0x1b18);
      auVar97 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar82 + 0x1f9c);
      auVar108 = vfmadd231ps_avx512vl(auVar108,local_120,auVar99);
      auVar99 = vmulps_avx512vl(local_5c0,auVar97);
      auVar109 = vmulps_avx512vl(local_5e0,auVar97);
      auVar97 = vmulps_avx512vl(local_580,auVar97);
      auVar104 = vfmadd231ps_avx512vl(auVar99,auVar96,local_620);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar96,local_5a0);
      auVar96 = vfmadd231ps_avx512vl(auVar97,local_160,auVar96);
      auVar99 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar82 + 0x1694);
      auVar97 = vfmadd231ps_avx512vl(auVar104,auVar99,local_500);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar99,local_4e0);
      auVar99 = vfmadd231ps_avx512vl(auVar96,local_140,auVar99);
      auVar87 = vfmadd231ps_fma(auVar97,auVar95,local_4a0);
      auVar96 = vfmadd231ps_avx512vl(auVar109,auVar95,local_4c0);
      auVar97 = vfmadd231ps_avx512vl(auVar99,local_120,auVar95);
      auVar187._8_4_ = 0x7fffffff;
      auVar187._0_8_ = 0x7fffffff7fffffff;
      auVar187._12_4_ = 0x7fffffff;
      auVar187._16_4_ = 0x7fffffff;
      auVar187._20_4_ = 0x7fffffff;
      auVar187._24_4_ = 0x7fffffff;
      auVar187._28_4_ = 0x7fffffff;
      auVar99 = vandps_avx(ZEXT1632(auVar88),auVar187);
      auVar95 = vandps_avx(auVar98,auVar187);
      auVar95 = vmaxps_avx(auVar99,auVar95);
      auVar99 = vandps_avx(auVar108,auVar187);
      auVar99 = vmaxps_avx(auVar95,auVar99);
      auVar108 = vbroadcastss_avx512vl(ZEXT416((uint)fVar146));
      uVar79 = vcmpps_avx512vl(auVar99,auVar108,1);
      bVar80 = (bool)((byte)uVar79 & 1);
      auVar110._0_4_ = (float)((uint)bVar80 * auVar92._0_4_ | (uint)!bVar80 * auVar88._0_4_);
      bVar80 = (bool)((byte)(uVar79 >> 1) & 1);
      auVar110._4_4_ = (float)((uint)bVar80 * auVar92._4_4_ | (uint)!bVar80 * auVar88._4_4_);
      bVar80 = (bool)((byte)(uVar79 >> 2) & 1);
      auVar110._8_4_ = (float)((uint)bVar80 * auVar92._8_4_ | (uint)!bVar80 * auVar88._8_4_);
      bVar80 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar110._12_4_ = (float)((uint)bVar80 * auVar92._12_4_ | (uint)!bVar80 * auVar88._12_4_);
      fVar144 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar92._16_4_);
      auVar110._16_4_ = fVar144;
      fVar139 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar92._20_4_);
      auVar110._20_4_ = fVar139;
      fVar145 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar92._24_4_);
      auVar110._24_4_ = fVar145;
      uVar1 = (uint)(byte)(uVar79 >> 7) * auVar92._28_4_;
      auVar110._28_4_ = uVar1;
      bVar80 = (bool)((byte)uVar79 & 1);
      auVar111._0_4_ = (float)((uint)bVar80 * auVar103._0_4_ | (uint)!bVar80 * auVar98._0_4_);
      bVar80 = (bool)((byte)(uVar79 >> 1) & 1);
      auVar111._4_4_ = (float)((uint)bVar80 * auVar103._4_4_ | (uint)!bVar80 * auVar98._4_4_);
      bVar80 = (bool)((byte)(uVar79 >> 2) & 1);
      auVar111._8_4_ = (float)((uint)bVar80 * auVar103._8_4_ | (uint)!bVar80 * auVar98._8_4_);
      bVar80 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar111._12_4_ = (float)((uint)bVar80 * auVar103._12_4_ | (uint)!bVar80 * auVar98._12_4_);
      bVar80 = (bool)((byte)(uVar79 >> 4) & 1);
      auVar111._16_4_ = (float)((uint)bVar80 * auVar103._16_4_ | (uint)!bVar80 * auVar98._16_4_);
      bVar80 = (bool)((byte)(uVar79 >> 5) & 1);
      auVar111._20_4_ = (float)((uint)bVar80 * auVar103._20_4_ | (uint)!bVar80 * auVar98._20_4_);
      bVar80 = (bool)((byte)(uVar79 >> 6) & 1);
      auVar111._24_4_ = (float)((uint)bVar80 * auVar103._24_4_ | (uint)!bVar80 * auVar98._24_4_);
      bVar80 = SUB81(uVar79 >> 7,0);
      auVar111._28_4_ = (uint)bVar80 * auVar103._28_4_ | (uint)!bVar80 * auVar98._28_4_;
      auVar99 = vandps_avx(auVar187,ZEXT1632(auVar87));
      auVar95 = vandps_avx(auVar96,auVar187);
      auVar95 = vmaxps_avx(auVar99,auVar95);
      auVar99 = vandps_avx(auVar97,auVar187);
      auVar99 = vmaxps_avx(auVar95,auVar99);
      uVar79 = vcmpps_avx512vl(auVar99,auVar108,1);
      bVar80 = (bool)((byte)uVar79 & 1);
      auVar112._0_4_ = (float)((uint)bVar80 * auVar92._0_4_ | (uint)!bVar80 * auVar87._0_4_);
      bVar80 = (bool)((byte)(uVar79 >> 1) & 1);
      auVar112._4_4_ = (float)((uint)bVar80 * auVar92._4_4_ | (uint)!bVar80 * auVar87._4_4_);
      bVar80 = (bool)((byte)(uVar79 >> 2) & 1);
      auVar112._8_4_ = (float)((uint)bVar80 * auVar92._8_4_ | (uint)!bVar80 * auVar87._8_4_);
      bVar80 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar112._12_4_ = (float)((uint)bVar80 * auVar92._12_4_ | (uint)!bVar80 * auVar87._12_4_);
      fVar174 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar92._16_4_);
      auVar112._16_4_ = fVar174;
      fVar173 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar92._20_4_);
      auVar112._20_4_ = fVar173;
      fVar175 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar92._24_4_);
      auVar112._24_4_ = fVar175;
      auVar112._28_4_ = (uint)(byte)(uVar79 >> 7) * auVar92._28_4_;
      bVar80 = (bool)((byte)uVar79 & 1);
      auVar113._0_4_ = (float)((uint)bVar80 * auVar103._0_4_ | (uint)!bVar80 * auVar96._0_4_);
      bVar80 = (bool)((byte)(uVar79 >> 1) & 1);
      auVar113._4_4_ = (float)((uint)bVar80 * auVar103._4_4_ | (uint)!bVar80 * auVar96._4_4_);
      bVar80 = (bool)((byte)(uVar79 >> 2) & 1);
      auVar113._8_4_ = (float)((uint)bVar80 * auVar103._8_4_ | (uint)!bVar80 * auVar96._8_4_);
      bVar80 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar113._12_4_ = (float)((uint)bVar80 * auVar103._12_4_ | (uint)!bVar80 * auVar96._12_4_);
      bVar80 = (bool)((byte)(uVar79 >> 4) & 1);
      auVar113._16_4_ = (float)((uint)bVar80 * auVar103._16_4_ | (uint)!bVar80 * auVar96._16_4_);
      bVar80 = (bool)((byte)(uVar79 >> 5) & 1);
      auVar113._20_4_ = (float)((uint)bVar80 * auVar103._20_4_ | (uint)!bVar80 * auVar96._20_4_);
      bVar80 = (bool)((byte)(uVar79 >> 6) & 1);
      auVar113._24_4_ = (float)((uint)bVar80 * auVar103._24_4_ | (uint)!bVar80 * auVar96._24_4_);
      bVar80 = SUB81(uVar79 >> 7,0);
      auVar113._28_4_ = (uint)bVar80 * auVar103._28_4_ | (uint)!bVar80 * auVar96._28_4_;
      auVar90 = vxorps_avx512vl(auVar151,auVar151);
      auVar190 = ZEXT1664(auVar90);
      auVar99 = vfmadd213ps_avx512vl(auVar110,auVar110,ZEXT1632(auVar90));
      auVar88 = vfmadd231ps_fma(auVar99,auVar111,auVar111);
      auVar99 = vrsqrt14ps_avx512vl(ZEXT1632(auVar88));
      fVar85 = auVar99._0_4_;
      fVar153 = auVar99._4_4_;
      fVar131 = auVar99._8_4_;
      fVar132 = auVar99._12_4_;
      fVar133 = auVar99._16_4_;
      fVar134 = auVar99._20_4_;
      fVar135 = auVar99._24_4_;
      auVar38._4_4_ = fVar153 * fVar153 * fVar153 * auVar88._4_4_ * -0.5;
      auVar38._0_4_ = fVar85 * fVar85 * fVar85 * auVar88._0_4_ * -0.5;
      auVar38._8_4_ = fVar131 * fVar131 * fVar131 * auVar88._8_4_ * -0.5;
      auVar38._12_4_ = fVar132 * fVar132 * fVar132 * auVar88._12_4_ * -0.5;
      auVar38._16_4_ = fVar133 * fVar133 * fVar133 * -0.0;
      auVar38._20_4_ = fVar134 * fVar134 * fVar134 * -0.0;
      auVar38._24_4_ = fVar135 * fVar135 * fVar135 * -0.0;
      auVar38._28_4_ = 0;
      auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar96 = vfmadd231ps_avx512vl(auVar38,auVar95,auVar99);
      auVar39._4_4_ = auVar111._4_4_ * auVar96._4_4_;
      auVar39._0_4_ = auVar111._0_4_ * auVar96._0_4_;
      auVar39._8_4_ = auVar111._8_4_ * auVar96._8_4_;
      auVar39._12_4_ = auVar111._12_4_ * auVar96._12_4_;
      auVar39._16_4_ = auVar111._16_4_ * auVar96._16_4_;
      auVar39._20_4_ = auVar111._20_4_ * auVar96._20_4_;
      auVar39._24_4_ = auVar111._24_4_ * auVar96._24_4_;
      auVar39._28_4_ = auVar99._28_4_;
      auVar40._4_4_ = auVar96._4_4_ * -auVar110._4_4_;
      auVar40._0_4_ = auVar96._0_4_ * -auVar110._0_4_;
      auVar40._8_4_ = auVar96._8_4_ * -auVar110._8_4_;
      auVar40._12_4_ = auVar96._12_4_ * -auVar110._12_4_;
      auVar40._16_4_ = auVar96._16_4_ * -fVar144;
      auVar40._20_4_ = auVar96._20_4_ * -fVar139;
      auVar40._24_4_ = auVar96._24_4_ * -fVar145;
      auVar40._28_4_ = uVar1 ^ 0x80000000;
      auVar99 = vmulps_avx512vl(auVar96,ZEXT1632(auVar90));
      auVar109 = ZEXT1632(auVar90);
      auVar97 = vfmadd213ps_avx512vl(auVar112,auVar112,auVar109);
      auVar88 = vfmadd231ps_fma(auVar97,auVar113,auVar113);
      auVar97 = vrsqrt14ps_avx512vl(ZEXT1632(auVar88));
      fVar139 = auVar97._0_4_;
      fVar144 = auVar97._4_4_;
      fVar145 = auVar97._8_4_;
      fVar85 = auVar97._12_4_;
      fVar153 = auVar97._16_4_;
      fVar131 = auVar97._20_4_;
      fVar132 = auVar97._24_4_;
      auVar41._4_4_ = fVar144 * fVar144 * fVar144 * auVar88._4_4_ * -0.5;
      auVar41._0_4_ = fVar139 * fVar139 * fVar139 * auVar88._0_4_ * -0.5;
      auVar41._8_4_ = fVar145 * fVar145 * fVar145 * auVar88._8_4_ * -0.5;
      auVar41._12_4_ = fVar85 * fVar85 * fVar85 * auVar88._12_4_ * -0.5;
      auVar41._16_4_ = fVar153 * fVar153 * fVar153 * -0.0;
      auVar41._20_4_ = fVar131 * fVar131 * fVar131 * -0.0;
      auVar41._24_4_ = fVar132 * fVar132 * fVar132 * -0.0;
      auVar41._28_4_ = 0;
      auVar95 = vfmadd231ps_avx512vl(auVar41,auVar95,auVar97);
      auVar42._4_4_ = auVar113._4_4_ * auVar95._4_4_;
      auVar42._0_4_ = auVar113._0_4_ * auVar95._0_4_;
      auVar42._8_4_ = auVar113._8_4_ * auVar95._8_4_;
      auVar42._12_4_ = auVar113._12_4_ * auVar95._12_4_;
      auVar42._16_4_ = auVar113._16_4_ * auVar95._16_4_;
      auVar42._20_4_ = auVar113._20_4_ * auVar95._20_4_;
      auVar42._24_4_ = auVar113._24_4_ * auVar95._24_4_;
      auVar42._28_4_ = auVar97._28_4_;
      auVar43._4_4_ = -auVar112._4_4_ * auVar95._4_4_;
      auVar43._0_4_ = -auVar112._0_4_ * auVar95._0_4_;
      auVar43._8_4_ = -auVar112._8_4_ * auVar95._8_4_;
      auVar43._12_4_ = -auVar112._12_4_ * auVar95._12_4_;
      auVar43._16_4_ = -fVar174 * auVar95._16_4_;
      auVar43._20_4_ = -fVar173 * auVar95._20_4_;
      auVar43._24_4_ = -fVar175 * auVar95._24_4_;
      auVar43._28_4_ = auVar96._28_4_;
      auVar95 = vmulps_avx512vl(auVar95,auVar109);
      auVar88 = vfmadd213ps_fma(auVar39,auVar105,auVar102);
      auVar87 = vfmadd213ps_fma(auVar40,auVar105,auVar93);
      auVar96 = vfmadd213ps_avx512vl(auVar99,auVar105,auVar101);
      auVar97 = vfmadd213ps_avx512vl(auVar42,ZEXT1632(auVar13),auVar94);
      auVar154 = vfnmadd213ps_fma(auVar39,auVar105,auVar102);
      auVar108 = ZEXT1632(auVar13);
      auVar86 = vfmadd213ps_fma(auVar43,auVar108,auVar91);
      auVar89 = vfnmadd213ps_fma(auVar40,auVar105,auVar93);
      auVar142 = vfmadd213ps_fma(auVar95,auVar108,auVar100);
      auVar98 = vfnmadd231ps_avx512vl(auVar101,auVar105,auVar99);
      auVar30 = vfnmadd213ps_fma(auVar42,auVar108,auVar94);
      auVar151 = vfnmadd213ps_fma(auVar43,auVar108,auVar91);
      auVar155 = vfnmadd231ps_fma(auVar100,ZEXT1632(auVar13),auVar95);
      auVar95 = vsubps_avx512vl(auVar97,ZEXT1632(auVar154));
      auVar99 = vsubps_avx(ZEXT1632(auVar86),ZEXT1632(auVar89));
      auVar100 = vsubps_avx512vl(ZEXT1632(auVar142),auVar98);
      auVar101 = vmulps_avx512vl(auVar99,auVar98);
      auVar150 = vfmsub231ps_fma(auVar101,ZEXT1632(auVar89),auVar100);
      auVar44._4_4_ = auVar154._4_4_ * auVar100._4_4_;
      auVar44._0_4_ = auVar154._0_4_ * auVar100._0_4_;
      auVar44._8_4_ = auVar154._8_4_ * auVar100._8_4_;
      auVar44._12_4_ = auVar154._12_4_ * auVar100._12_4_;
      auVar44._16_4_ = auVar100._16_4_ * 0.0;
      auVar44._20_4_ = auVar100._20_4_ * 0.0;
      auVar44._24_4_ = auVar100._24_4_ * 0.0;
      auVar44._28_4_ = auVar100._28_4_;
      auVar100 = vfmsub231ps_avx512vl(auVar44,auVar98,auVar95);
      auVar45._4_4_ = auVar89._4_4_ * auVar95._4_4_;
      auVar45._0_4_ = auVar89._0_4_ * auVar95._0_4_;
      auVar45._8_4_ = auVar89._8_4_ * auVar95._8_4_;
      auVar45._12_4_ = auVar89._12_4_ * auVar95._12_4_;
      auVar45._16_4_ = auVar95._16_4_ * 0.0;
      auVar45._20_4_ = auVar95._20_4_ * 0.0;
      auVar45._24_4_ = auVar95._24_4_ * 0.0;
      auVar45._28_4_ = auVar95._28_4_;
      auVar177 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar154),auVar99);
      auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar177),auVar109,auVar100);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar109,ZEXT1632(auVar150));
      auVar91 = ZEXT1632(auVar90);
      uVar79 = vcmpps_avx512vl(auVar99,auVar91,2);
      bVar76 = (byte)uVar79;
      fVar85 = (float)((uint)(bVar76 & 1) * auVar88._0_4_ |
                      (uint)!(bool)(bVar76 & 1) * auVar30._0_4_);
      bVar80 = (bool)((byte)(uVar79 >> 1) & 1);
      fVar131 = (float)((uint)bVar80 * auVar88._4_4_ | (uint)!bVar80 * auVar30._4_4_);
      bVar80 = (bool)((byte)(uVar79 >> 2) & 1);
      fVar133 = (float)((uint)bVar80 * auVar88._8_4_ | (uint)!bVar80 * auVar30._8_4_);
      bVar80 = (bool)((byte)(uVar79 >> 3) & 1);
      fVar135 = (float)((uint)bVar80 * auVar88._12_4_ | (uint)!bVar80 * auVar30._12_4_);
      auVar101 = ZEXT1632(CONCAT412(fVar135,CONCAT48(fVar133,CONCAT44(fVar131,fVar85))));
      fVar153 = (float)((uint)(bVar76 & 1) * auVar87._0_4_ |
                       (uint)!(bool)(bVar76 & 1) * auVar151._0_4_);
      bVar80 = (bool)((byte)(uVar79 >> 1) & 1);
      fVar132 = (float)((uint)bVar80 * auVar87._4_4_ | (uint)!bVar80 * auVar151._4_4_);
      bVar80 = (bool)((byte)(uVar79 >> 2) & 1);
      fVar134 = (float)((uint)bVar80 * auVar87._8_4_ | (uint)!bVar80 * auVar151._8_4_);
      bVar80 = (bool)((byte)(uVar79 >> 3) & 1);
      fVar136 = (float)((uint)bVar80 * auVar87._12_4_ | (uint)!bVar80 * auVar151._12_4_);
      auVar108 = ZEXT1632(CONCAT412(fVar136,CONCAT48(fVar134,CONCAT44(fVar132,fVar153))));
      auVar114._0_4_ =
           (float)((uint)(bVar76 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar155._0_4_);
      bVar80 = (bool)((byte)(uVar79 >> 1) & 1);
      auVar114._4_4_ = (float)((uint)bVar80 * auVar96._4_4_ | (uint)!bVar80 * auVar155._4_4_);
      bVar80 = (bool)((byte)(uVar79 >> 2) & 1);
      auVar114._8_4_ = (float)((uint)bVar80 * auVar96._8_4_ | (uint)!bVar80 * auVar155._8_4_);
      bVar80 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar114._12_4_ = (float)((uint)bVar80 * auVar96._12_4_ | (uint)!bVar80 * auVar155._12_4_);
      fVar139 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar96._16_4_);
      auVar114._16_4_ = fVar139;
      fVar144 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar96._20_4_);
      auVar114._20_4_ = fVar144;
      fVar145 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar96._24_4_);
      auVar114._24_4_ = fVar145;
      iVar2 = (uint)(byte)(uVar79 >> 7) * auVar96._28_4_;
      auVar114._28_4_ = iVar2;
      auVar95 = vblendmps_avx512vl(ZEXT1632(auVar154),auVar97);
      auVar115._0_4_ =
           (uint)(bVar76 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar87._0_4_;
      bVar80 = (bool)((byte)(uVar79 >> 1) & 1);
      auVar115._4_4_ = (uint)bVar80 * auVar95._4_4_ | (uint)!bVar80 * auVar87._4_4_;
      bVar80 = (bool)((byte)(uVar79 >> 2) & 1);
      auVar115._8_4_ = (uint)bVar80 * auVar95._8_4_ | (uint)!bVar80 * auVar87._8_4_;
      bVar80 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar115._12_4_ = (uint)bVar80 * auVar95._12_4_ | (uint)!bVar80 * auVar87._12_4_;
      auVar115._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * auVar95._16_4_;
      auVar115._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * auVar95._20_4_;
      auVar115._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * auVar95._24_4_;
      auVar115._28_4_ = (uint)(byte)(uVar79 >> 7) * auVar95._28_4_;
      auVar95 = vblendmps_avx512vl(ZEXT1632(auVar89),ZEXT1632(auVar86));
      auVar116._0_4_ =
           (float)((uint)(bVar76 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar150._0_4_);
      bVar80 = (bool)((byte)(uVar79 >> 1) & 1);
      auVar116._4_4_ = (float)((uint)bVar80 * auVar95._4_4_ | (uint)!bVar80 * auVar150._4_4_);
      bVar80 = (bool)((byte)(uVar79 >> 2) & 1);
      auVar116._8_4_ = (float)((uint)bVar80 * auVar95._8_4_ | (uint)!bVar80 * auVar150._8_4_);
      bVar80 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar116._12_4_ = (float)((uint)bVar80 * auVar95._12_4_ | (uint)!bVar80 * auVar150._12_4_);
      fVar175 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar95._16_4_);
      auVar116._16_4_ = fVar175;
      fVar173 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar95._20_4_);
      auVar116._20_4_ = fVar173;
      fVar174 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar95._24_4_);
      auVar116._24_4_ = fVar174;
      auVar116._28_4_ = (uint)(byte)(uVar79 >> 7) * auVar95._28_4_;
      auVar95 = vblendmps_avx512vl(auVar98,ZEXT1632(auVar142));
      auVar117._0_4_ =
           (float)((uint)(bVar76 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar96._0_4_);
      bVar80 = (bool)((byte)(uVar79 >> 1) & 1);
      auVar117._4_4_ = (float)((uint)bVar80 * auVar95._4_4_ | (uint)!bVar80 * auVar96._4_4_);
      bVar80 = (bool)((byte)(uVar79 >> 2) & 1);
      auVar117._8_4_ = (float)((uint)bVar80 * auVar95._8_4_ | (uint)!bVar80 * auVar96._8_4_);
      bVar80 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar117._12_4_ = (float)((uint)bVar80 * auVar95._12_4_ | (uint)!bVar80 * auVar96._12_4_);
      bVar80 = (bool)((byte)(uVar79 >> 4) & 1);
      auVar117._16_4_ = (float)((uint)bVar80 * auVar95._16_4_ | (uint)!bVar80 * auVar96._16_4_);
      bVar80 = (bool)((byte)(uVar79 >> 5) & 1);
      auVar117._20_4_ = (float)((uint)bVar80 * auVar95._20_4_ | (uint)!bVar80 * auVar96._20_4_);
      bVar80 = (bool)((byte)(uVar79 >> 6) & 1);
      auVar117._24_4_ = (float)((uint)bVar80 * auVar95._24_4_ | (uint)!bVar80 * auVar96._24_4_);
      bVar80 = SUB81(uVar79 >> 7,0);
      auVar117._28_4_ = (uint)bVar80 * auVar95._28_4_ | (uint)!bVar80 * auVar96._28_4_;
      auVar118._0_4_ =
           (uint)(bVar76 & 1) * (int)auVar154._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar97._0_4_;
      bVar80 = (bool)((byte)(uVar79 >> 1) & 1);
      auVar118._4_4_ = (uint)bVar80 * (int)auVar154._4_4_ | (uint)!bVar80 * auVar97._4_4_;
      bVar80 = (bool)((byte)(uVar79 >> 2) & 1);
      auVar118._8_4_ = (uint)bVar80 * (int)auVar154._8_4_ | (uint)!bVar80 * auVar97._8_4_;
      bVar80 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar118._12_4_ = (uint)bVar80 * (int)auVar154._12_4_ | (uint)!bVar80 * auVar97._12_4_;
      auVar118._16_4_ = (uint)!(bool)((byte)(uVar79 >> 4) & 1) * auVar97._16_4_;
      auVar118._20_4_ = (uint)!(bool)((byte)(uVar79 >> 5) & 1) * auVar97._20_4_;
      auVar118._24_4_ = (uint)!(bool)((byte)(uVar79 >> 6) & 1) * auVar97._24_4_;
      auVar118._28_4_ = (uint)!SUB81(uVar79 >> 7,0) * auVar97._28_4_;
      bVar80 = (bool)((byte)(uVar79 >> 1) & 1);
      bVar19 = (bool)((byte)(uVar79 >> 2) & 1);
      bVar20 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar119._0_4_ =
           (uint)(bVar76 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar142._0_4_;
      bVar18 = (bool)((byte)(uVar79 >> 1) & 1);
      auVar119._4_4_ = (uint)bVar18 * auVar98._4_4_ | (uint)!bVar18 * auVar142._4_4_;
      bVar18 = (bool)((byte)(uVar79 >> 2) & 1);
      auVar119._8_4_ = (uint)bVar18 * auVar98._8_4_ | (uint)!bVar18 * auVar142._8_4_;
      bVar18 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar119._12_4_ = (uint)bVar18 * auVar98._12_4_ | (uint)!bVar18 * auVar142._12_4_;
      auVar119._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * auVar98._16_4_;
      auVar119._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * auVar98._20_4_;
      auVar119._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * auVar98._24_4_;
      iVar3 = (uint)(byte)(uVar79 >> 7) * auVar98._28_4_;
      auVar119._28_4_ = iVar3;
      auVar109 = vsubps_avx512vl(auVar118,auVar101);
      auVar95 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar89._12_4_ |
                                              (uint)!bVar20 * auVar86._12_4_,
                                              CONCAT48((uint)bVar19 * (int)auVar89._8_4_ |
                                                       (uint)!bVar19 * auVar86._8_4_,
                                                       CONCAT44((uint)bVar80 * (int)auVar89._4_4_ |
                                                                (uint)!bVar80 * auVar86._4_4_,
                                                                (uint)(bVar76 & 1) *
                                                                (int)auVar89._0_4_ |
                                                                (uint)!(bool)(bVar76 & 1) *
                                                                auVar86._0_4_)))),auVar108);
      auVar96 = vsubps_avx(auVar119,auVar114);
      auVar97 = vsubps_avx(auVar101,auVar115);
      auVar98 = vsubps_avx(auVar108,auVar116);
      auVar100 = vsubps_avx(auVar114,auVar117);
      auVar46._4_4_ = auVar96._4_4_ * fVar131;
      auVar46._0_4_ = auVar96._0_4_ * fVar85;
      auVar46._8_4_ = auVar96._8_4_ * fVar133;
      auVar46._12_4_ = auVar96._12_4_ * fVar135;
      auVar46._16_4_ = auVar96._16_4_ * 0.0;
      auVar46._20_4_ = auVar96._20_4_ * 0.0;
      auVar46._24_4_ = auVar96._24_4_ * 0.0;
      auVar46._28_4_ = iVar3;
      auVar88 = vfmsub231ps_fma(auVar46,auVar114,auVar109);
      auVar47._4_4_ = fVar132 * auVar109._4_4_;
      auVar47._0_4_ = fVar153 * auVar109._0_4_;
      auVar47._8_4_ = fVar134 * auVar109._8_4_;
      auVar47._12_4_ = fVar136 * auVar109._12_4_;
      auVar47._16_4_ = auVar109._16_4_ * 0.0;
      auVar47._20_4_ = auVar109._20_4_ * 0.0;
      auVar47._24_4_ = auVar109._24_4_ * 0.0;
      auVar47._28_4_ = auVar99._28_4_;
      auVar87 = vfmsub231ps_fma(auVar47,auVar101,auVar95);
      auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar91,ZEXT1632(auVar88));
      auVar163._0_4_ = auVar95._0_4_ * auVar114._0_4_;
      auVar163._4_4_ = auVar95._4_4_ * auVar114._4_4_;
      auVar163._8_4_ = auVar95._8_4_ * auVar114._8_4_;
      auVar163._12_4_ = auVar95._12_4_ * auVar114._12_4_;
      auVar163._16_4_ = auVar95._16_4_ * fVar139;
      auVar163._20_4_ = auVar95._20_4_ * fVar144;
      auVar163._24_4_ = auVar95._24_4_ * fVar145;
      auVar163._28_4_ = 0;
      auVar88 = vfmsub231ps_fma(auVar163,auVar108,auVar96);
      auVar102 = vfmadd231ps_avx512vl(auVar99,auVar91,ZEXT1632(auVar88));
      auVar99 = vmulps_avx512vl(auVar100,auVar115);
      auVar99 = vfmsub231ps_avx512vl(auVar99,auVar97,auVar117);
      auVar48._4_4_ = auVar98._4_4_ * auVar117._4_4_;
      auVar48._0_4_ = auVar98._0_4_ * auVar117._0_4_;
      auVar48._8_4_ = auVar98._8_4_ * auVar117._8_4_;
      auVar48._12_4_ = auVar98._12_4_ * auVar117._12_4_;
      auVar48._16_4_ = auVar98._16_4_ * auVar117._16_4_;
      auVar48._20_4_ = auVar98._20_4_ * auVar117._20_4_;
      auVar48._24_4_ = auVar98._24_4_ * auVar117._24_4_;
      auVar48._28_4_ = auVar117._28_4_;
      auVar88 = vfmsub231ps_fma(auVar48,auVar116,auVar100);
      auVar164._0_4_ = auVar116._0_4_ * auVar97._0_4_;
      auVar164._4_4_ = auVar116._4_4_ * auVar97._4_4_;
      auVar164._8_4_ = auVar116._8_4_ * auVar97._8_4_;
      auVar164._12_4_ = auVar116._12_4_ * auVar97._12_4_;
      auVar164._16_4_ = fVar175 * auVar97._16_4_;
      auVar164._20_4_ = fVar173 * auVar97._20_4_;
      auVar164._24_4_ = fVar174 * auVar97._24_4_;
      auVar164._28_4_ = 0;
      auVar87 = vfmsub231ps_fma(auVar164,auVar98,auVar115);
      auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar91,auVar99);
      auVar93 = vfmadd231ps_avx512vl(auVar99,auVar91,ZEXT1632(auVar88));
      auVar99 = vmaxps_avx(auVar102,auVar93);
      uVar141 = vcmpps_avx512vl(auVar99,auVar91,2);
      bVar84 = bVar84 & (byte)uVar141;
      auVar191 = ZEXT3264(local_4a0);
      auVar192 = ZEXT3264(local_4c0);
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar197 = ZEXT3264(auVar94);
      auVar193 = ZEXT3264(local_500);
      auVar189 = ZEXT3264(local_620);
      if (bVar84 == 0) {
        bVar80 = false;
        auVar194 = ZEXT3264(local_5a0);
        auVar195 = ZEXT3264(local_5c0);
        auVar196 = ZEXT3264(local_5e0);
      }
      else {
        auVar49._4_4_ = auVar100._4_4_ * auVar95._4_4_;
        auVar49._0_4_ = auVar100._0_4_ * auVar95._0_4_;
        auVar49._8_4_ = auVar100._8_4_ * auVar95._8_4_;
        auVar49._12_4_ = auVar100._12_4_ * auVar95._12_4_;
        auVar49._16_4_ = auVar100._16_4_ * auVar95._16_4_;
        auVar49._20_4_ = auVar100._20_4_ * auVar95._20_4_;
        auVar49._24_4_ = auVar100._24_4_ * auVar95._24_4_;
        auVar49._28_4_ = auVar99._28_4_;
        auVar86 = vfmsub231ps_fma(auVar49,auVar98,auVar96);
        auVar50._4_4_ = auVar96._4_4_ * auVar97._4_4_;
        auVar50._0_4_ = auVar96._0_4_ * auVar97._0_4_;
        auVar50._8_4_ = auVar96._8_4_ * auVar97._8_4_;
        auVar50._12_4_ = auVar96._12_4_ * auVar97._12_4_;
        auVar50._16_4_ = auVar96._16_4_ * auVar97._16_4_;
        auVar50._20_4_ = auVar96._20_4_ * auVar97._20_4_;
        auVar50._24_4_ = auVar96._24_4_ * auVar97._24_4_;
        auVar50._28_4_ = auVar96._28_4_;
        auVar87 = vfmsub231ps_fma(auVar50,auVar109,auVar100);
        auVar51._4_4_ = auVar98._4_4_ * auVar109._4_4_;
        auVar51._0_4_ = auVar98._0_4_ * auVar109._0_4_;
        auVar51._8_4_ = auVar98._8_4_ * auVar109._8_4_;
        auVar51._12_4_ = auVar98._12_4_ * auVar109._12_4_;
        auVar51._16_4_ = auVar98._16_4_ * auVar109._16_4_;
        auVar51._20_4_ = auVar98._20_4_ * auVar109._20_4_;
        auVar51._24_4_ = auVar98._24_4_ * auVar109._24_4_;
        auVar51._28_4_ = auVar98._28_4_;
        auVar142 = vfmsub231ps_fma(auVar51,auVar97,auVar95);
        auVar88 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar87),ZEXT1632(auVar142));
        auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar86),auVar91);
        auVar95 = vrcp14ps_avx512vl(auVar99);
        auVar96 = vfnmadd213ps_avx512vl(auVar95,auVar99,auVar94);
        auVar88 = vfmadd132ps_fma(auVar96,auVar95,auVar95);
        auVar52._4_4_ = auVar142._4_4_ * auVar114._4_4_;
        auVar52._0_4_ = auVar142._0_4_ * auVar114._0_4_;
        auVar52._8_4_ = auVar142._8_4_ * auVar114._8_4_;
        auVar52._12_4_ = auVar142._12_4_ * auVar114._12_4_;
        auVar52._16_4_ = fVar139 * 0.0;
        auVar52._20_4_ = fVar144 * 0.0;
        auVar52._24_4_ = fVar145 * 0.0;
        auVar52._28_4_ = iVar2;
        auVar87 = vfmadd231ps_fma(auVar52,auVar108,ZEXT1632(auVar87));
        auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar101,ZEXT1632(auVar86));
        fVar139 = auVar88._0_4_;
        fVar144 = auVar88._4_4_;
        fVar145 = auVar88._8_4_;
        fVar174 = auVar88._12_4_;
        local_3a0 = ZEXT1632(CONCAT412(auVar87._12_4_ * fVar174,
                                       CONCAT48(auVar87._8_4_ * fVar145,
                                                CONCAT44(auVar87._4_4_ * fVar144,
                                                         auVar87._0_4_ * fVar139))));
        auVar176._4_4_ = uVar180;
        auVar176._0_4_ = uVar180;
        auVar176._8_4_ = uVar180;
        auVar176._12_4_ = uVar180;
        auVar176._16_4_ = uVar180;
        auVar176._20_4_ = uVar180;
        auVar176._24_4_ = uVar180;
        auVar176._28_4_ = uVar180;
        uVar141 = vcmpps_avx512vl(auVar176,local_3a0,2);
        uVar140 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar31._4_4_ = uVar140;
        auVar31._0_4_ = uVar140;
        auVar31._8_4_ = uVar140;
        auVar31._12_4_ = uVar140;
        auVar31._16_4_ = uVar140;
        auVar31._20_4_ = uVar140;
        auVar31._24_4_ = uVar140;
        auVar31._28_4_ = uVar140;
        uVar28 = vcmpps_avx512vl(local_3a0,auVar31,2);
        bVar84 = (byte)uVar141 & (byte)uVar28 & bVar84;
        auVar194 = ZEXT3264(local_5a0);
        auVar195 = ZEXT3264(local_5c0);
        auVar196 = ZEXT3264(local_5e0);
        if (bVar84 != 0) {
          uVar141 = vcmpps_avx512vl(auVar99,auVar91,4);
          bVar84 = bVar84 & (byte)uVar141;
          if (bVar84 != 0) {
            fVar173 = auVar102._0_4_ * fVar139;
            fVar175 = auVar102._4_4_ * fVar144;
            auVar53._4_4_ = fVar175;
            auVar53._0_4_ = fVar173;
            fVar85 = auVar102._8_4_ * fVar145;
            auVar53._8_4_ = fVar85;
            fVar153 = auVar102._12_4_ * fVar174;
            auVar53._12_4_ = fVar153;
            fVar131 = auVar102._16_4_ * 0.0;
            auVar53._16_4_ = fVar131;
            fVar132 = auVar102._20_4_ * 0.0;
            auVar53._20_4_ = fVar132;
            fVar133 = auVar102._24_4_ * 0.0;
            auVar53._24_4_ = fVar133;
            auVar53._28_4_ = auVar99._28_4_;
            auVar95 = vsubps_avx512vl(auVar94,auVar53);
            local_3e0._0_4_ =
                 (float)((uint)(bVar76 & 1) * (int)fVar173 |
                        (uint)!(bool)(bVar76 & 1) * auVar95._0_4_);
            bVar80 = (bool)((byte)(uVar79 >> 1) & 1);
            local_3e0._4_4_ = (float)((uint)bVar80 * (int)fVar175 | (uint)!bVar80 * auVar95._4_4_);
            bVar80 = (bool)((byte)(uVar79 >> 2) & 1);
            local_3e0._8_4_ = (float)((uint)bVar80 * (int)fVar85 | (uint)!bVar80 * auVar95._8_4_);
            bVar80 = (bool)((byte)(uVar79 >> 3) & 1);
            local_3e0._12_4_ = (float)((uint)bVar80 * (int)fVar153 | (uint)!bVar80 * auVar95._12_4_)
            ;
            bVar80 = (bool)((byte)(uVar79 >> 4) & 1);
            local_3e0._16_4_ = (float)((uint)bVar80 * (int)fVar131 | (uint)!bVar80 * auVar95._16_4_)
            ;
            bVar80 = (bool)((byte)(uVar79 >> 5) & 1);
            local_3e0._20_4_ = (float)((uint)bVar80 * (int)fVar132 | (uint)!bVar80 * auVar95._20_4_)
            ;
            bVar80 = (bool)((byte)(uVar79 >> 6) & 1);
            local_3e0._24_4_ = (float)((uint)bVar80 * (int)fVar133 | (uint)!bVar80 * auVar95._24_4_)
            ;
            bVar80 = SUB81(uVar79 >> 7,0);
            local_3e0._28_4_ =
                 (float)((uint)bVar80 * auVar99._28_4_ | (uint)!bVar80 * auVar95._28_4_);
            auVar99 = vsubps_avx(ZEXT1632(auVar13),auVar105);
            auVar88 = vfmadd213ps_fma(auVar99,local_3e0,auVar105);
            uVar140 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
            auVar32._4_4_ = uVar140;
            auVar32._0_4_ = uVar140;
            auVar32._8_4_ = uVar140;
            auVar32._12_4_ = uVar140;
            auVar32._16_4_ = uVar140;
            auVar32._20_4_ = uVar140;
            auVar32._24_4_ = uVar140;
            auVar32._28_4_ = uVar140;
            auVar99 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar88._12_4_ + auVar88._12_4_,
                                                         CONCAT48(auVar88._8_4_ + auVar88._8_4_,
                                                                  CONCAT44(auVar88._4_4_ +
                                                                           auVar88._4_4_,
                                                                           auVar88._0_4_ +
                                                                           auVar88._0_4_)))),auVar32
                                     );
            uVar141 = vcmpps_avx512vl(local_3a0,auVar99,6);
            if (((byte)uVar141 & bVar84) != 0) {
              auVar152._0_4_ = auVar93._0_4_ * fVar139;
              auVar152._4_4_ = auVar93._4_4_ * fVar144;
              auVar152._8_4_ = auVar93._8_4_ * fVar145;
              auVar152._12_4_ = auVar93._12_4_ * fVar174;
              auVar152._16_4_ = auVar93._16_4_ * 0.0;
              auVar152._20_4_ = auVar93._20_4_ * 0.0;
              auVar152._24_4_ = auVar93._24_4_ * 0.0;
              auVar152._28_4_ = 0;
              auVar99 = vsubps_avx512vl(auVar94,auVar152);
              auVar120._0_4_ =
                   (uint)(bVar76 & 1) * (int)auVar152._0_4_ |
                   (uint)!(bool)(bVar76 & 1) * auVar99._0_4_;
              bVar80 = (bool)((byte)(uVar79 >> 1) & 1);
              auVar120._4_4_ = (uint)bVar80 * (int)auVar152._4_4_ | (uint)!bVar80 * auVar99._4_4_;
              bVar80 = (bool)((byte)(uVar79 >> 2) & 1);
              auVar120._8_4_ = (uint)bVar80 * (int)auVar152._8_4_ | (uint)!bVar80 * auVar99._8_4_;
              bVar80 = (bool)((byte)(uVar79 >> 3) & 1);
              auVar120._12_4_ = (uint)bVar80 * (int)auVar152._12_4_ | (uint)!bVar80 * auVar99._12_4_
              ;
              bVar80 = (bool)((byte)(uVar79 >> 4) & 1);
              auVar120._16_4_ = (uint)bVar80 * (int)auVar152._16_4_ | (uint)!bVar80 * auVar99._16_4_
              ;
              bVar80 = (bool)((byte)(uVar79 >> 5) & 1);
              auVar120._20_4_ = (uint)bVar80 * (int)auVar152._20_4_ | (uint)!bVar80 * auVar99._20_4_
              ;
              bVar80 = (bool)((byte)(uVar79 >> 6) & 1);
              auVar120._24_4_ = (uint)bVar80 * (int)auVar152._24_4_ | (uint)!bVar80 * auVar99._24_4_
              ;
              auVar120._28_4_ = (uint)!SUB81(uVar79 >> 7,0) * auVar99._28_4_;
              auVar33._8_4_ = 0x40000000;
              auVar33._0_8_ = 0x4000000040000000;
              auVar33._12_4_ = 0x40000000;
              auVar33._16_4_ = 0x40000000;
              auVar33._20_4_ = 0x40000000;
              auVar33._24_4_ = 0x40000000;
              auVar33._28_4_ = 0x40000000;
              local_3c0 = vfmsub132ps_avx512vl(auVar120,auVar94,auVar33);
              local_380 = 0;
              if ((pGVar16->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (bVar80 = true, pGVar16->occlusionFilterN == (RTCFilterFunctionN)0x0))
                goto LAB_01a58cec;
                fVar139 = 1.0 / (float)local_420._0_4_;
                local_320[0] = fVar139 * (local_3e0._0_4_ + 0.0);
                local_320[1] = fVar139 * (local_3e0._4_4_ + 1.0);
                local_320[2] = fVar139 * (local_3e0._8_4_ + 2.0);
                local_320[3] = fVar139 * (local_3e0._12_4_ + 3.0);
                fStack_310 = fVar139 * (local_3e0._16_4_ + 4.0);
                fStack_30c = fVar139 * (local_3e0._20_4_ + 5.0);
                fStack_308 = fVar139 * (local_3e0._24_4_ + 6.0);
                fStack_304 = local_3e0._28_4_ + 7.0;
                local_300 = local_3c0;
                local_2e0 = local_3a0;
                lVar77 = 0;
                uVar81 = (ulong)((byte)uVar141 & bVar84);
                for (uVar79 = uVar81; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000)
                {
                  lVar77 = lVar77 + 1;
                }
                local_480 = vpbroadcastd_avx512vl();
                local_37c = iVar15;
                local_370 = auVar26;
                local_360 = uVar27;
                uStack_358 = uVar29;
                local_350 = uVar72;
                uStack_348 = uVar73;
                while (auVar88 = auVar190._0_16_, uVar81 != 0) {
                  local_460 = *(float *)(ray + k * 4 + 0x100);
                  fVar139 = local_320[lVar77];
                  auVar147._4_4_ = fVar139;
                  auVar147._0_4_ = fVar139;
                  auVar147._8_4_ = fVar139;
                  auVar147._12_4_ = fVar139;
                  local_220._16_4_ = fVar139;
                  local_220._0_16_ = auVar147;
                  local_220._20_4_ = fVar139;
                  local_220._24_4_ = fVar139;
                  local_220._28_4_ = fVar139;
                  local_400 = (float)lVar77;
                  fStack_3fc = (float)((ulong)lVar77 >> 0x20);
                  local_200 = *(undefined4 *)(local_300 + lVar77 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2e0 + lVar77 * 4);
                  local_650.context = context->user;
                  fVar144 = 1.0 - fVar139;
                  auVar142 = vfnmadd231ss_fma(ZEXT416((uint)(fVar139 * (fVar144 + fVar144))),
                                              ZEXT416((uint)fVar144),ZEXT416((uint)fVar144));
                  auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar147,
                                            ZEXT416(0xc0a00000));
                  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar139 * fVar139 * 3.0)),
                                            ZEXT416((uint)(fVar139 + fVar139)),auVar87);
                  auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar147,
                                            ZEXT416(0x40000000));
                  auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar144 * fVar144 * -3.0)),
                                            ZEXT416((uint)(fVar144 + fVar144)),auVar87);
                  auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar139 * fVar139)),auVar147,
                                            ZEXT416((uint)(fVar144 * -2.0)));
                  fVar139 = auVar142._0_4_ * 0.5;
                  fVar144 = auVar13._0_4_ * 0.5;
                  fVar145 = auVar87._0_4_ * 0.5;
                  fVar174 = auVar86._0_4_ * 0.5;
                  auVar156._0_4_ = fVar174 * local_5f0;
                  auVar156._4_4_ = fVar174 * fStack_5ec;
                  auVar156._8_4_ = fVar174 * fStack_5e8;
                  auVar156._12_4_ = fVar174 * fStack_5e4;
                  auVar169._4_4_ = fVar145;
                  auVar169._0_4_ = fVar145;
                  auVar169._8_4_ = fVar145;
                  auVar169._12_4_ = fVar145;
                  auVar87 = vfmadd132ps_fma(auVar169,auVar156,auVar9);
                  auVar157._4_4_ = fVar144;
                  auVar157._0_4_ = fVar144;
                  auVar157._8_4_ = fVar144;
                  auVar157._12_4_ = fVar144;
                  auVar87 = vfmadd132ps_fma(auVar157,auVar87,auVar10);
                  auVar142._4_4_ = fVar139;
                  auVar142._0_4_ = fVar139;
                  auVar142._8_4_ = fVar139;
                  auVar142._12_4_ = fVar139;
                  auVar87 = vfmadd213ps_fma(auVar142,auVar26,auVar87);
                  local_280 = auVar87._0_4_;
                  auVar165._8_4_ = 1;
                  auVar165._0_8_ = 0x100000001;
                  auVar165._12_4_ = 1;
                  auVar165._16_4_ = 1;
                  auVar165._20_4_ = 1;
                  auVar165._24_4_ = 1;
                  auVar165._28_4_ = 1;
                  local_260 = vpermps_avx2(auVar165,ZEXT1632(auVar87));
                  auVar171._8_4_ = 2;
                  auVar171._0_8_ = 0x200000002;
                  auVar171._12_4_ = 2;
                  auVar171._16_4_ = 2;
                  auVar171._20_4_ = 2;
                  auVar171._24_4_ = 2;
                  auVar171._28_4_ = 2;
                  local_240 = vpermps_avx2(auVar171,ZEXT1632(auVar87));
                  uStack_27c = local_280;
                  uStack_278 = local_280;
                  uStack_274 = local_280;
                  uStack_270 = local_280;
                  uStack_26c = local_280;
                  uStack_268 = local_280;
                  uStack_264 = local_280;
                  uStack_1fc = local_200;
                  uStack_1f8 = local_200;
                  uStack_1f4 = local_200;
                  uStack_1f0 = local_200;
                  uStack_1ec = local_200;
                  uStack_1e8 = local_200;
                  uStack_1e4 = local_200;
                  local_1e0 = local_2a0._0_8_;
                  uStack_1d8 = local_2a0._8_8_;
                  uStack_1d0 = local_2a0._16_8_;
                  uStack_1c8 = local_2a0._24_8_;
                  local_1c0 = local_480;
                  vpcmpeqd_avx2(local_480,local_480);
                  local_1a0 = (local_650.context)->instID[0];
                  uStack_19c = local_1a0;
                  uStack_198 = local_1a0;
                  uStack_194 = local_1a0;
                  uStack_190 = local_1a0;
                  uStack_18c = local_1a0;
                  uStack_188 = local_1a0;
                  uStack_184 = local_1a0;
                  local_180 = (local_650.context)->instPrimID[0];
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_560 = local_2c0;
                  local_650.valid = (int *)local_560;
                  local_650.geometryUserPtr = pGVar16->userPtr;
                  local_650.hit = (RTCHitN *)&local_280;
                  local_650.N = 8;
                  local_440 = (uint)uVar81;
                  uStack_43c = (uint)(uVar81 >> 0x20);
                  local_650.ray = (RTCRayN *)ray;
                  if (pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar16->occlusionFilterN)(&local_650);
                    uVar81 = CONCAT44(uStack_43c,local_440);
                    auVar196 = ZEXT3264(local_5e0);
                    auVar195 = ZEXT3264(local_5c0);
                    auVar194 = ZEXT3264(local_5a0);
                    auVar189 = ZEXT3264(local_620);
                    auVar198 = ZEXT3264(local_4e0);
                    auVar193 = ZEXT3264(local_500);
                    auVar192 = ZEXT3264(local_4c0);
                    auVar191 = ZEXT3264(local_4a0);
                    auVar88 = vxorps_avx512vl(auVar88,auVar88);
                    auVar190 = ZEXT1664(auVar88);
                    auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar197 = ZEXT3264(auVar99);
                    uVar180 = local_520._0_4_;
                  }
                  auVar88 = auVar190._0_16_;
                  if (local_560 != (undefined1  [32])0x0) {
                    p_Var17 = context->args->filter;
                    if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar16->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var17)(&local_650);
                      uVar81 = CONCAT44(uStack_43c,local_440);
                      auVar196 = ZEXT3264(local_5e0);
                      auVar195 = ZEXT3264(local_5c0);
                      auVar194 = ZEXT3264(local_5a0);
                      auVar189 = ZEXT3264(local_620);
                      auVar198 = ZEXT3264(local_4e0);
                      auVar193 = ZEXT3264(local_500);
                      auVar192 = ZEXT3264(local_4c0);
                      auVar191 = ZEXT3264(local_4a0);
                      auVar88 = vxorps_avx512vl(auVar88,auVar88);
                      auVar190 = ZEXT1664(auVar88);
                      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar197 = ZEXT3264(auVar99);
                      uVar180 = local_520._0_4_;
                    }
                    uVar79 = vptestmd_avx512vl(local_560,local_560);
                    auVar99 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar80 = (bool)((byte)uVar79 & 1);
                    bVar18 = (bool)((byte)(uVar79 >> 1) & 1);
                    bVar19 = (bool)((byte)(uVar79 >> 2) & 1);
                    bVar20 = (bool)((byte)(uVar79 >> 3) & 1);
                    bVar21 = (bool)((byte)(uVar79 >> 4) & 1);
                    bVar22 = (bool)((byte)(uVar79 >> 5) & 1);
                    bVar23 = (bool)((byte)(uVar79 >> 6) & 1);
                    bVar24 = SUB81(uVar79 >> 7,0);
                    *(uint *)(local_650.ray + 0x100) =
                         (uint)bVar80 * auVar99._0_4_ |
                         (uint)!bVar80 * *(int *)(local_650.ray + 0x100);
                    *(uint *)(local_650.ray + 0x104) =
                         (uint)bVar18 * auVar99._4_4_ |
                         (uint)!bVar18 * *(int *)(local_650.ray + 0x104);
                    *(uint *)(local_650.ray + 0x108) =
                         (uint)bVar19 * auVar99._8_4_ |
                         (uint)!bVar19 * *(int *)(local_650.ray + 0x108);
                    *(uint *)(local_650.ray + 0x10c) =
                         (uint)bVar20 * auVar99._12_4_ |
                         (uint)!bVar20 * *(int *)(local_650.ray + 0x10c);
                    *(uint *)(local_650.ray + 0x110) =
                         (uint)bVar21 * auVar99._16_4_ |
                         (uint)!bVar21 * *(int *)(local_650.ray + 0x110);
                    *(uint *)(local_650.ray + 0x114) =
                         (uint)bVar22 * auVar99._20_4_ |
                         (uint)!bVar22 * *(int *)(local_650.ray + 0x114);
                    *(uint *)(local_650.ray + 0x118) =
                         (uint)bVar23 * auVar99._24_4_ |
                         (uint)!bVar23 * *(int *)(local_650.ray + 0x118);
                    *(uint *)(local_650.ray + 0x11c) =
                         (uint)bVar24 * auVar99._28_4_ |
                         (uint)!bVar24 * *(int *)(local_650.ray + 0x11c);
                    if (local_560 != (undefined1  [32])0x0) {
                      bVar80 = true;
                      goto LAB_01a58cec;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = local_460;
                  lVar77 = 0;
                  uVar81 = uVar81 ^ 1L << ((ulong)(uint)local_400 & 0x3f);
                  for (uVar79 = uVar81; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000
                      ) {
                    lVar77 = lVar77 + 1;
                  }
                }
              }
            }
          }
        }
        bVar80 = false;
      }
    }
LAB_01a58cec:
    if (8 < iVar15) {
      local_520 = vpbroadcastd_avx512vl();
      local_460 = 1.0 / (float)local_420._0_4_;
      local_420 = vpbroadcastd_avx512vl();
      fStack_45c = local_460;
      fStack_458 = local_460;
      fStack_454 = local_460;
      fStack_450 = local_460;
      fStack_44c = local_460;
      fStack_448 = local_460;
      fStack_444 = local_460;
      local_440 = uVar180;
      uStack_43c = uVar180;
      uStack_438 = uVar180;
      uStack_434 = uVar180;
      uStack_430 = uVar180;
      uStack_42c = uVar180;
      uStack_428 = uVar180;
      uStack_424 = uVar180;
      local_400 = fVar146;
      fStack_3fc = fVar146;
      fStack_3f8 = fVar146;
      fStack_3f4 = fVar146;
      fStack_3f0 = fVar146;
      fStack_3ec = fVar146;
      fStack_3e8 = fVar146;
      fStack_3e4 = fVar146;
      for (lVar77 = 8; lVar77 < iVar15; lVar77 = lVar77 + 8) {
        auVar99 = vpbroadcastd_avx512vl();
        auVar98 = vpor_avx2(auVar99,_DAT_01fb4ba0);
        uVar28 = vpcmpd_avx512vl(auVar98,local_520,1);
        auVar99 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar77 * 4 + lVar82);
        auVar95 = *(undefined1 (*) [32])(lVar82 + 0x22047f0 + lVar77 * 4);
        auVar96 = *(undefined1 (*) [32])(lVar82 + 0x2204c74 + lVar77 * 4);
        auVar97 = *(undefined1 (*) [32])(lVar82 + 0x22050f8 + lVar77 * 4);
        local_5c0 = auVar195._0_32_;
        auVar100 = vmulps_avx512vl(local_5c0,auVar97);
        local_5e0 = auVar196._0_32_;
        auVar101 = vmulps_avx512vl(local_5e0,auVar97);
        auVar54._4_4_ = auVar97._4_4_ * (float)local_100._4_4_;
        auVar54._0_4_ = auVar97._0_4_ * (float)local_100._0_4_;
        auVar54._8_4_ = auVar97._8_4_ * fStack_f8;
        auVar54._12_4_ = auVar97._12_4_ * fStack_f4;
        auVar54._16_4_ = auVar97._16_4_ * fStack_f0;
        auVar54._20_4_ = auVar97._20_4_ * fStack_ec;
        auVar54._24_4_ = auVar97._24_4_ * fStack_e8;
        auVar54._28_4_ = auVar98._28_4_;
        auVar106 = auVar189._0_32_;
        auVar98 = vfmadd231ps_avx512vl(auVar100,auVar96,auVar106);
        local_5a0 = auVar194._0_32_;
        auVar100 = vfmadd231ps_avx512vl(auVar101,auVar96,local_5a0);
        auVar101 = vfmadd231ps_avx512vl(auVar54,auVar96,local_e0);
        auVar107 = auVar193._0_32_;
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar95,auVar107);
        local_4e0 = auVar198._0_32_;
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar95,local_4e0);
        auVar88 = vfmadd231ps_fma(auVar101,auVar95,local_c0);
        local_4a0 = auVar191._0_32_;
        auVar93 = vfmadd231ps_avx512vl(auVar98,auVar99,local_4a0);
        local_4c0 = auVar192._0_32_;
        auVar94 = vfmadd231ps_avx512vl(auVar100,auVar99,local_4c0);
        auVar98 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar77 * 4 + lVar82);
        auVar100 = *(undefined1 (*) [32])(lVar82 + 0x2206c10 + lVar77 * 4);
        auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar99,local_a0);
        auVar101 = *(undefined1 (*) [32])(lVar82 + 0x2207094 + lVar77 * 4);
        auVar108 = *(undefined1 (*) [32])(lVar82 + 0x2207518 + lVar77 * 4);
        auVar109 = vmulps_avx512vl(local_5c0,auVar108);
        auVar102 = vmulps_avx512vl(local_5e0,auVar108);
        auVar55._4_4_ = auVar108._4_4_ * (float)local_100._4_4_;
        auVar55._0_4_ = auVar108._0_4_ * (float)local_100._0_4_;
        auVar55._8_4_ = auVar108._8_4_ * fStack_f8;
        auVar55._12_4_ = auVar108._12_4_ * fStack_f4;
        auVar55._16_4_ = auVar108._16_4_ * fStack_f0;
        auVar55._20_4_ = auVar108._20_4_ * fStack_ec;
        auVar55._24_4_ = auVar108._24_4_ * fStack_e8;
        auVar55._28_4_ = uStack_e4;
        auVar109 = vfmadd231ps_avx512vl(auVar109,auVar101,auVar106);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar101,local_5a0);
        auVar91 = vfmadd231ps_avx512vl(auVar55,auVar101,local_e0);
        auVar109 = vfmadd231ps_avx512vl(auVar109,auVar100,auVar107);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar100,local_4e0);
        auVar87 = vfmadd231ps_fma(auVar91,auVar100,local_c0);
        auVar91 = vfmadd231ps_avx512vl(auVar109,auVar98,local_4a0);
        auVar92 = vfmadd231ps_avx512vl(auVar102,auVar98,local_4c0);
        auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar98,local_a0);
        auVar103 = vmaxps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar87));
        auVar109 = vsubps_avx(auVar91,auVar93);
        auVar102 = vsubps_avx(auVar92,auVar94);
        auVar104 = vmulps_avx512vl(auVar94,auVar109);
        auVar105 = vmulps_avx512vl(auVar93,auVar102);
        auVar104 = vsubps_avx512vl(auVar104,auVar105);
        auVar105 = vmulps_avx512vl(auVar102,auVar102);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar109,auVar109);
        auVar103 = vmulps_avx512vl(auVar103,auVar103);
        auVar103 = vmulps_avx512vl(auVar103,auVar105);
        auVar104 = vmulps_avx512vl(auVar104,auVar104);
        uVar141 = vcmpps_avx512vl(auVar104,auVar103,2);
        bVar84 = (byte)uVar28 & (byte)uVar141;
        if (bVar84 == 0) {
          auVar198 = ZEXT3264(local_4e0);
          auVar189 = ZEXT3264(auVar106);
        }
        else {
          auVar108 = vmulps_avx512vl(local_580,auVar108);
          auVar101 = vfmadd213ps_avx512vl(auVar101,local_160,auVar108);
          auVar100 = vfmadd213ps_avx512vl(auVar100,local_140,auVar101);
          auVar98 = vfmadd213ps_avx512vl(auVar98,local_120,auVar100);
          auVar97 = vmulps_avx512vl(local_580,auVar97);
          auVar96 = vfmadd213ps_avx512vl(auVar96,local_160,auVar97);
          auVar95 = vfmadd213ps_avx512vl(auVar95,local_140,auVar96);
          auVar100 = vfmadd213ps_avx512vl(auVar99,local_120,auVar95);
          auVar99 = *(undefined1 (*) [32])(lVar82 + 0x220557c + lVar77 * 4);
          auVar95 = *(undefined1 (*) [32])(lVar82 + 0x2205a00 + lVar77 * 4);
          auVar96 = *(undefined1 (*) [32])(lVar82 + 0x2205e84 + lVar77 * 4);
          auVar97 = *(undefined1 (*) [32])(lVar82 + 0x2206308 + lVar77 * 4);
          auVar101 = vmulps_avx512vl(local_5c0,auVar97);
          auVar108 = vmulps_avx512vl(local_5e0,auVar97);
          auVar97 = vmulps_avx512vl(local_580,auVar97);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar96,auVar106);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar96,local_5a0);
          auVar96 = vfmadd231ps_avx512vl(auVar97,local_160,auVar96);
          auVar97 = vfmadd231ps_avx512vl(auVar101,auVar95,auVar107);
          auVar101 = vfmadd231ps_avx512vl(auVar108,auVar95,local_4e0);
          auVar95 = vfmadd231ps_avx512vl(auVar96,local_140,auVar95);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar99,local_4a0);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar99,local_4c0);
          auVar108 = vfmadd231ps_avx512vl(auVar95,local_120,auVar99);
          auVar99 = *(undefined1 (*) [32])(lVar82 + 0x220799c + lVar77 * 4);
          auVar95 = *(undefined1 (*) [32])(lVar82 + 0x22082a4 + lVar77 * 4);
          auVar96 = *(undefined1 (*) [32])(lVar82 + 0x2208728 + lVar77 * 4);
          auVar103 = vmulps_avx512vl(local_5c0,auVar96);
          auVar104 = vmulps_avx512vl(local_5e0,auVar96);
          auVar96 = vmulps_avx512vl(local_580,auVar96);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar95,auVar106);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar95,local_5a0);
          auVar96 = vfmadd231ps_avx512vl(auVar96,local_160,auVar95);
          auVar95 = *(undefined1 (*) [32])(lVar82 + 0x2207e20 + lVar77 * 4);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar95,auVar107);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar95,local_4e0);
          auVar95 = vfmadd231ps_avx512vl(auVar96,local_140,auVar95);
          auVar96 = vfmadd231ps_avx512vl(auVar103,auVar99,local_4a0);
          auVar103 = vfmadd231ps_avx512vl(auVar104,auVar99,local_4c0);
          auVar95 = vfmadd231ps_avx512vl(auVar95,local_120,auVar99);
          auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar97,auVar104);
          vandps_avx512vl(auVar101,auVar104);
          auVar99 = vmaxps_avx(auVar104,auVar104);
          vandps_avx512vl(auVar108,auVar104);
          auVar99 = vmaxps_avx(auVar99,auVar104);
          auVar75._4_4_ = fStack_3fc;
          auVar75._0_4_ = local_400;
          auVar75._8_4_ = fStack_3f8;
          auVar75._12_4_ = fStack_3f4;
          auVar75._16_4_ = fStack_3f0;
          auVar75._20_4_ = fStack_3ec;
          auVar75._24_4_ = fStack_3e8;
          auVar75._28_4_ = fStack_3e4;
          uVar79 = vcmpps_avx512vl(auVar99,auVar75,1);
          bVar18 = (bool)((byte)uVar79 & 1);
          auVar121._0_4_ = (float)((uint)bVar18 * auVar109._0_4_ | (uint)!bVar18 * auVar97._0_4_);
          bVar18 = (bool)((byte)(uVar79 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar18 * auVar109._4_4_ | (uint)!bVar18 * auVar97._4_4_);
          bVar18 = (bool)((byte)(uVar79 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar18 * auVar109._8_4_ | (uint)!bVar18 * auVar97._8_4_);
          bVar18 = (bool)((byte)(uVar79 >> 3) & 1);
          auVar121._12_4_ = (float)((uint)bVar18 * auVar109._12_4_ | (uint)!bVar18 * auVar97._12_4_)
          ;
          bVar18 = (bool)((byte)(uVar79 >> 4) & 1);
          auVar121._16_4_ = (float)((uint)bVar18 * auVar109._16_4_ | (uint)!bVar18 * auVar97._16_4_)
          ;
          bVar18 = (bool)((byte)(uVar79 >> 5) & 1);
          auVar121._20_4_ = (float)((uint)bVar18 * auVar109._20_4_ | (uint)!bVar18 * auVar97._20_4_)
          ;
          bVar18 = (bool)((byte)(uVar79 >> 6) & 1);
          auVar121._24_4_ = (float)((uint)bVar18 * auVar109._24_4_ | (uint)!bVar18 * auVar97._24_4_)
          ;
          bVar18 = SUB81(uVar79 >> 7,0);
          auVar121._28_4_ = (uint)bVar18 * auVar109._28_4_ | (uint)!bVar18 * auVar97._28_4_;
          bVar18 = (bool)((byte)uVar79 & 1);
          auVar122._0_4_ = (float)((uint)bVar18 * auVar102._0_4_ | (uint)!bVar18 * auVar101._0_4_);
          bVar18 = (bool)((byte)(uVar79 >> 1) & 1);
          auVar122._4_4_ = (float)((uint)bVar18 * auVar102._4_4_ | (uint)!bVar18 * auVar101._4_4_);
          bVar18 = (bool)((byte)(uVar79 >> 2) & 1);
          auVar122._8_4_ = (float)((uint)bVar18 * auVar102._8_4_ | (uint)!bVar18 * auVar101._8_4_);
          bVar18 = (bool)((byte)(uVar79 >> 3) & 1);
          auVar122._12_4_ =
               (float)((uint)bVar18 * auVar102._12_4_ | (uint)!bVar18 * auVar101._12_4_);
          bVar18 = (bool)((byte)(uVar79 >> 4) & 1);
          auVar122._16_4_ =
               (float)((uint)bVar18 * auVar102._16_4_ | (uint)!bVar18 * auVar101._16_4_);
          bVar18 = (bool)((byte)(uVar79 >> 5) & 1);
          auVar122._20_4_ =
               (float)((uint)bVar18 * auVar102._20_4_ | (uint)!bVar18 * auVar101._20_4_);
          bVar18 = (bool)((byte)(uVar79 >> 6) & 1);
          auVar122._24_4_ =
               (float)((uint)bVar18 * auVar102._24_4_ | (uint)!bVar18 * auVar101._24_4_);
          bVar18 = SUB81(uVar79 >> 7,0);
          auVar122._28_4_ = (uint)bVar18 * auVar102._28_4_ | (uint)!bVar18 * auVar101._28_4_;
          vandps_avx512vl(auVar96,auVar104);
          vandps_avx512vl(auVar103,auVar104);
          auVar99 = vmaxps_avx(auVar122,auVar122);
          vandps_avx512vl(auVar95,auVar104);
          auVar99 = vmaxps_avx(auVar99,auVar122);
          uVar79 = vcmpps_avx512vl(auVar99,auVar75,1);
          bVar18 = (bool)((byte)uVar79 & 1);
          auVar123._0_4_ = (uint)bVar18 * auVar109._0_4_ | (uint)!bVar18 * auVar96._0_4_;
          bVar18 = (bool)((byte)(uVar79 >> 1) & 1);
          auVar123._4_4_ = (uint)bVar18 * auVar109._4_4_ | (uint)!bVar18 * auVar96._4_4_;
          bVar18 = (bool)((byte)(uVar79 >> 2) & 1);
          auVar123._8_4_ = (uint)bVar18 * auVar109._8_4_ | (uint)!bVar18 * auVar96._8_4_;
          bVar18 = (bool)((byte)(uVar79 >> 3) & 1);
          auVar123._12_4_ = (uint)bVar18 * auVar109._12_4_ | (uint)!bVar18 * auVar96._12_4_;
          bVar18 = (bool)((byte)(uVar79 >> 4) & 1);
          auVar123._16_4_ = (uint)bVar18 * auVar109._16_4_ | (uint)!bVar18 * auVar96._16_4_;
          bVar18 = (bool)((byte)(uVar79 >> 5) & 1);
          auVar123._20_4_ = (uint)bVar18 * auVar109._20_4_ | (uint)!bVar18 * auVar96._20_4_;
          bVar18 = (bool)((byte)(uVar79 >> 6) & 1);
          auVar123._24_4_ = (uint)bVar18 * auVar109._24_4_ | (uint)!bVar18 * auVar96._24_4_;
          bVar18 = SUB81(uVar79 >> 7,0);
          auVar123._28_4_ = (uint)bVar18 * auVar109._28_4_ | (uint)!bVar18 * auVar96._28_4_;
          bVar18 = (bool)((byte)uVar79 & 1);
          auVar124._0_4_ = (float)((uint)bVar18 * auVar102._0_4_ | (uint)!bVar18 * auVar103._0_4_);
          bVar18 = (bool)((byte)(uVar79 >> 1) & 1);
          auVar124._4_4_ = (float)((uint)bVar18 * auVar102._4_4_ | (uint)!bVar18 * auVar103._4_4_);
          bVar18 = (bool)((byte)(uVar79 >> 2) & 1);
          auVar124._8_4_ = (float)((uint)bVar18 * auVar102._8_4_ | (uint)!bVar18 * auVar103._8_4_);
          bVar18 = (bool)((byte)(uVar79 >> 3) & 1);
          auVar124._12_4_ =
               (float)((uint)bVar18 * auVar102._12_4_ | (uint)!bVar18 * auVar103._12_4_);
          bVar18 = (bool)((byte)(uVar79 >> 4) & 1);
          auVar124._16_4_ =
               (float)((uint)bVar18 * auVar102._16_4_ | (uint)!bVar18 * auVar103._16_4_);
          bVar18 = (bool)((byte)(uVar79 >> 5) & 1);
          auVar124._20_4_ =
               (float)((uint)bVar18 * auVar102._20_4_ | (uint)!bVar18 * auVar103._20_4_);
          bVar18 = (bool)((byte)(uVar79 >> 6) & 1);
          auVar124._24_4_ =
               (float)((uint)bVar18 * auVar102._24_4_ | (uint)!bVar18 * auVar103._24_4_);
          bVar18 = SUB81(uVar79 >> 7,0);
          auVar124._28_4_ = (uint)bVar18 * auVar102._28_4_ | (uint)!bVar18 * auVar103._28_4_;
          auVar179._8_4_ = 0x80000000;
          auVar179._0_8_ = 0x8000000080000000;
          auVar179._12_4_ = 0x80000000;
          auVar179._16_4_ = 0x80000000;
          auVar179._20_4_ = 0x80000000;
          auVar179._24_4_ = 0x80000000;
          auVar179._28_4_ = 0x80000000;
          auVar99 = vxorps_avx512vl(auVar123,auVar179);
          auVar103 = auVar190._0_32_;
          auVar95 = vfmadd213ps_avx512vl(auVar121,auVar121,auVar103);
          auVar9 = vfmadd231ps_fma(auVar95,auVar122,auVar122);
          auVar95 = vrsqrt14ps_avx512vl(ZEXT1632(auVar9));
          auVar188._8_4_ = 0xbf000000;
          auVar188._0_8_ = 0xbf000000bf000000;
          auVar188._12_4_ = 0xbf000000;
          auVar188._16_4_ = 0xbf000000;
          auVar188._20_4_ = 0xbf000000;
          auVar188._24_4_ = 0xbf000000;
          auVar188._28_4_ = 0xbf000000;
          fVar146 = auVar95._0_4_;
          fVar139 = auVar95._4_4_;
          fVar144 = auVar95._8_4_;
          fVar145 = auVar95._12_4_;
          fVar174 = auVar95._16_4_;
          fVar173 = auVar95._20_4_;
          fVar175 = auVar95._24_4_;
          auVar56._4_4_ = fVar139 * fVar139 * fVar139 * auVar9._4_4_ * -0.5;
          auVar56._0_4_ = fVar146 * fVar146 * fVar146 * auVar9._0_4_ * -0.5;
          auVar56._8_4_ = fVar144 * fVar144 * fVar144 * auVar9._8_4_ * -0.5;
          auVar56._12_4_ = fVar145 * fVar145 * fVar145 * auVar9._12_4_ * -0.5;
          auVar56._16_4_ = fVar174 * fVar174 * fVar174 * -0.0;
          auVar56._20_4_ = fVar173 * fVar173 * fVar173 * -0.0;
          auVar56._24_4_ = fVar175 * fVar175 * fVar175 * -0.0;
          auVar56._28_4_ = auVar122._28_4_;
          auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar95 = vfmadd231ps_avx512vl(auVar56,auVar96,auVar95);
          auVar57._4_4_ = auVar122._4_4_ * auVar95._4_4_;
          auVar57._0_4_ = auVar122._0_4_ * auVar95._0_4_;
          auVar57._8_4_ = auVar122._8_4_ * auVar95._8_4_;
          auVar57._12_4_ = auVar122._12_4_ * auVar95._12_4_;
          auVar57._16_4_ = auVar122._16_4_ * auVar95._16_4_;
          auVar57._20_4_ = auVar122._20_4_ * auVar95._20_4_;
          auVar57._24_4_ = auVar122._24_4_ * auVar95._24_4_;
          auVar57._28_4_ = 0;
          auVar58._4_4_ = auVar95._4_4_ * -auVar121._4_4_;
          auVar58._0_4_ = auVar95._0_4_ * -auVar121._0_4_;
          auVar58._8_4_ = auVar95._8_4_ * -auVar121._8_4_;
          auVar58._12_4_ = auVar95._12_4_ * -auVar121._12_4_;
          auVar58._16_4_ = auVar95._16_4_ * -auVar121._16_4_;
          auVar58._20_4_ = auVar95._20_4_ * -auVar121._20_4_;
          auVar58._24_4_ = auVar95._24_4_ * -auVar121._24_4_;
          auVar58._28_4_ = auVar122._28_4_;
          auVar97 = vmulps_avx512vl(auVar95,auVar103);
          auVar95 = vfmadd213ps_avx512vl(auVar123,auVar123,auVar103);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar124,auVar124);
          auVar101 = vrsqrt14ps_avx512vl(auVar95);
          auVar95 = vmulps_avx512vl(auVar95,auVar188);
          fVar146 = auVar101._0_4_;
          fVar139 = auVar101._4_4_;
          fVar144 = auVar101._8_4_;
          fVar145 = auVar101._12_4_;
          fVar174 = auVar101._16_4_;
          fVar173 = auVar101._20_4_;
          fVar175 = auVar101._24_4_;
          auVar59._4_4_ = fVar139 * fVar139 * fVar139 * auVar95._4_4_;
          auVar59._0_4_ = fVar146 * fVar146 * fVar146 * auVar95._0_4_;
          auVar59._8_4_ = fVar144 * fVar144 * fVar144 * auVar95._8_4_;
          auVar59._12_4_ = fVar145 * fVar145 * fVar145 * auVar95._12_4_;
          auVar59._16_4_ = fVar174 * fVar174 * fVar174 * auVar95._16_4_;
          auVar59._20_4_ = fVar173 * fVar173 * fVar173 * auVar95._20_4_;
          auVar59._24_4_ = fVar175 * fVar175 * fVar175 * auVar95._24_4_;
          auVar59._28_4_ = auVar95._28_4_;
          auVar95 = vfmadd231ps_avx512vl(auVar59,auVar96,auVar101);
          auVar60._4_4_ = auVar124._4_4_ * auVar95._4_4_;
          auVar60._0_4_ = auVar124._0_4_ * auVar95._0_4_;
          auVar60._8_4_ = auVar124._8_4_ * auVar95._8_4_;
          auVar60._12_4_ = auVar124._12_4_ * auVar95._12_4_;
          auVar60._16_4_ = auVar124._16_4_ * auVar95._16_4_;
          auVar60._20_4_ = auVar124._20_4_ * auVar95._20_4_;
          auVar60._24_4_ = auVar124._24_4_ * auVar95._24_4_;
          auVar60._28_4_ = auVar101._28_4_;
          auVar61._4_4_ = auVar95._4_4_ * auVar99._4_4_;
          auVar61._0_4_ = auVar95._0_4_ * auVar99._0_4_;
          auVar61._8_4_ = auVar95._8_4_ * auVar99._8_4_;
          auVar61._12_4_ = auVar95._12_4_ * auVar99._12_4_;
          auVar61._16_4_ = auVar95._16_4_ * auVar99._16_4_;
          auVar61._20_4_ = auVar95._20_4_ * auVar99._20_4_;
          auVar61._24_4_ = auVar95._24_4_ * auVar99._24_4_;
          auVar61._28_4_ = auVar99._28_4_;
          auVar99 = vmulps_avx512vl(auVar95,auVar103);
          auVar9 = vfmadd213ps_fma(auVar57,ZEXT1632(auVar88),auVar93);
          auVar95 = ZEXT1632(auVar88);
          auVar10 = vfmadd213ps_fma(auVar58,auVar95,auVar94);
          auVar96 = vfmadd213ps_avx512vl(auVar97,auVar95,auVar100);
          auVar101 = vfmadd213ps_avx512vl(auVar60,ZEXT1632(auVar87),auVar91);
          auVar177 = vfnmadd213ps_fma(auVar57,auVar95,auVar93);
          auVar108 = ZEXT1632(auVar87);
          auVar13 = vfmadd213ps_fma(auVar61,auVar108,auVar92);
          auVar154 = vfnmadd213ps_fma(auVar58,auVar95,auVar94);
          auVar86 = vfmadd213ps_fma(auVar99,auVar108,auVar98);
          auVar94 = ZEXT1632(auVar88);
          auVar151 = vfnmadd231ps_fma(auVar100,auVar94,auVar97);
          auVar89 = vfnmadd213ps_fma(auVar60,auVar108,auVar91);
          auVar30 = vfnmadd213ps_fma(auVar61,auVar108,auVar92);
          auVar155 = vfnmadd231ps_fma(auVar98,ZEXT1632(auVar87),auVar99);
          auVar98 = vsubps_avx512vl(auVar101,ZEXT1632(auVar177));
          auVar99 = vsubps_avx(ZEXT1632(auVar13),ZEXT1632(auVar154));
          auVar95 = vsubps_avx(ZEXT1632(auVar86),ZEXT1632(auVar151));
          auVar62._4_4_ = auVar99._4_4_ * auVar151._4_4_;
          auVar62._0_4_ = auVar99._0_4_ * auVar151._0_4_;
          auVar62._8_4_ = auVar99._8_4_ * auVar151._8_4_;
          auVar62._12_4_ = auVar99._12_4_ * auVar151._12_4_;
          auVar62._16_4_ = auVar99._16_4_ * 0.0;
          auVar62._20_4_ = auVar99._20_4_ * 0.0;
          auVar62._24_4_ = auVar99._24_4_ * 0.0;
          auVar62._28_4_ = auVar97._28_4_;
          auVar88 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar154),auVar95);
          auVar63._4_4_ = auVar95._4_4_ * auVar177._4_4_;
          auVar63._0_4_ = auVar95._0_4_ * auVar177._0_4_;
          auVar63._8_4_ = auVar95._8_4_ * auVar177._8_4_;
          auVar63._12_4_ = auVar95._12_4_ * auVar177._12_4_;
          auVar63._16_4_ = auVar95._16_4_ * 0.0;
          auVar63._20_4_ = auVar95._20_4_ * 0.0;
          auVar63._24_4_ = auVar95._24_4_ * 0.0;
          auVar63._28_4_ = auVar95._28_4_;
          auVar142 = vfmsub231ps_fma(auVar63,ZEXT1632(auVar151),auVar98);
          auVar64._4_4_ = auVar154._4_4_ * auVar98._4_4_;
          auVar64._0_4_ = auVar154._0_4_ * auVar98._0_4_;
          auVar64._8_4_ = auVar154._8_4_ * auVar98._8_4_;
          auVar64._12_4_ = auVar154._12_4_ * auVar98._12_4_;
          auVar64._16_4_ = auVar98._16_4_ * 0.0;
          auVar64._20_4_ = auVar98._20_4_ * 0.0;
          auVar64._24_4_ = auVar98._24_4_ * 0.0;
          auVar64._28_4_ = auVar98._28_4_;
          auVar150 = vfmsub231ps_fma(auVar64,ZEXT1632(auVar177),auVar99);
          auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar150),auVar103,ZEXT1632(auVar142));
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar103,ZEXT1632(auVar88));
          uVar79 = vcmpps_avx512vl(auVar99,auVar103,2);
          bVar76 = (byte)uVar79;
          fVar131 = (float)((uint)(bVar76 & 1) * auVar9._0_4_ |
                           (uint)!(bool)(bVar76 & 1) * auVar89._0_4_);
          bVar18 = (bool)((byte)(uVar79 >> 1) & 1);
          fVar133 = (float)((uint)bVar18 * auVar9._4_4_ | (uint)!bVar18 * auVar89._4_4_);
          bVar18 = (bool)((byte)(uVar79 >> 2) & 1);
          fVar135 = (float)((uint)bVar18 * auVar9._8_4_ | (uint)!bVar18 * auVar89._8_4_);
          bVar18 = (bool)((byte)(uVar79 >> 3) & 1);
          fVar137 = (float)((uint)bVar18 * auVar9._12_4_ | (uint)!bVar18 * auVar89._12_4_);
          auVar108 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar135,CONCAT44(fVar133,fVar131))));
          fVar132 = (float)((uint)(bVar76 & 1) * auVar10._0_4_ |
                           (uint)!(bool)(bVar76 & 1) * auVar30._0_4_);
          bVar18 = (bool)((byte)(uVar79 >> 1) & 1);
          fVar134 = (float)((uint)bVar18 * auVar10._4_4_ | (uint)!bVar18 * auVar30._4_4_);
          bVar18 = (bool)((byte)(uVar79 >> 2) & 1);
          fVar136 = (float)((uint)bVar18 * auVar10._8_4_ | (uint)!bVar18 * auVar30._8_4_);
          bVar18 = (bool)((byte)(uVar79 >> 3) & 1);
          fVar138 = (float)((uint)bVar18 * auVar10._12_4_ | (uint)!bVar18 * auVar30._12_4_);
          auVar109 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar136,CONCAT44(fVar134,fVar132))));
          auVar125._0_4_ =
               (float)((uint)(bVar76 & 1) * auVar96._0_4_ |
                      (uint)!(bool)(bVar76 & 1) * auVar155._0_4_);
          bVar18 = (bool)((byte)(uVar79 >> 1) & 1);
          auVar125._4_4_ = (float)((uint)bVar18 * auVar96._4_4_ | (uint)!bVar18 * auVar155._4_4_);
          bVar18 = (bool)((byte)(uVar79 >> 2) & 1);
          auVar125._8_4_ = (float)((uint)bVar18 * auVar96._8_4_ | (uint)!bVar18 * auVar155._8_4_);
          bVar18 = (bool)((byte)(uVar79 >> 3) & 1);
          auVar125._12_4_ = (float)((uint)bVar18 * auVar96._12_4_ | (uint)!bVar18 * auVar155._12_4_)
          ;
          fVar146 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar96._16_4_);
          auVar125._16_4_ = fVar146;
          fVar139 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar96._20_4_);
          auVar125._20_4_ = fVar139;
          fVar144 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar96._24_4_);
          auVar125._24_4_ = fVar144;
          iVar2 = (uint)(byte)(uVar79 >> 7) * auVar96._28_4_;
          auVar125._28_4_ = iVar2;
          auVar99 = vblendmps_avx512vl(ZEXT1632(auVar177),auVar101);
          auVar126._0_4_ =
               (uint)(bVar76 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar88._0_4_;
          bVar18 = (bool)((byte)(uVar79 >> 1) & 1);
          auVar126._4_4_ = (uint)bVar18 * auVar99._4_4_ | (uint)!bVar18 * auVar88._4_4_;
          bVar18 = (bool)((byte)(uVar79 >> 2) & 1);
          auVar126._8_4_ = (uint)bVar18 * auVar99._8_4_ | (uint)!bVar18 * auVar88._8_4_;
          bVar18 = (bool)((byte)(uVar79 >> 3) & 1);
          auVar126._12_4_ = (uint)bVar18 * auVar99._12_4_ | (uint)!bVar18 * auVar88._12_4_;
          auVar126._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * auVar99._16_4_;
          auVar126._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * auVar99._20_4_;
          auVar126._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * auVar99._24_4_;
          auVar126._28_4_ = (uint)(byte)(uVar79 >> 7) * auVar99._28_4_;
          auVar99 = vblendmps_avx512vl(ZEXT1632(auVar154),ZEXT1632(auVar13));
          auVar127._0_4_ =
               (float)((uint)(bVar76 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar9._0_4_
                      );
          bVar18 = (bool)((byte)(uVar79 >> 1) & 1);
          auVar127._4_4_ = (float)((uint)bVar18 * auVar99._4_4_ | (uint)!bVar18 * auVar9._4_4_);
          bVar18 = (bool)((byte)(uVar79 >> 2) & 1);
          auVar127._8_4_ = (float)((uint)bVar18 * auVar99._8_4_ | (uint)!bVar18 * auVar9._8_4_);
          bVar18 = (bool)((byte)(uVar79 >> 3) & 1);
          auVar127._12_4_ = (float)((uint)bVar18 * auVar99._12_4_ | (uint)!bVar18 * auVar9._12_4_);
          fVar145 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar99._16_4_);
          auVar127._16_4_ = fVar145;
          fVar174 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar99._20_4_);
          auVar127._20_4_ = fVar174;
          fVar173 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar99._24_4_);
          auVar127._24_4_ = fVar173;
          auVar127._28_4_ = (uint)(byte)(uVar79 >> 7) * auVar99._28_4_;
          auVar99 = vblendmps_avx512vl(ZEXT1632(auVar151),ZEXT1632(auVar86));
          auVar128._0_4_ =
               (float)((uint)(bVar76 & 1) * auVar99._0_4_ |
                      (uint)!(bool)(bVar76 & 1) * auVar10._0_4_);
          bVar18 = (bool)((byte)(uVar79 >> 1) & 1);
          auVar128._4_4_ = (float)((uint)bVar18 * auVar99._4_4_ | (uint)!bVar18 * auVar10._4_4_);
          bVar18 = (bool)((byte)(uVar79 >> 2) & 1);
          auVar128._8_4_ = (float)((uint)bVar18 * auVar99._8_4_ | (uint)!bVar18 * auVar10._8_4_);
          bVar18 = (bool)((byte)(uVar79 >> 3) & 1);
          auVar128._12_4_ = (float)((uint)bVar18 * auVar99._12_4_ | (uint)!bVar18 * auVar10._12_4_);
          fVar175 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar99._16_4_);
          auVar128._16_4_ = fVar175;
          fVar153 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar99._20_4_);
          auVar128._20_4_ = fVar153;
          fVar85 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar99._24_4_);
          auVar128._24_4_ = fVar85;
          iVar3 = (uint)(byte)(uVar79 >> 7) * auVar99._28_4_;
          auVar128._28_4_ = iVar3;
          auVar129._0_4_ =
               (uint)(bVar76 & 1) * (int)auVar177._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar101._0_4_
          ;
          bVar18 = (bool)((byte)(uVar79 >> 1) & 1);
          auVar129._4_4_ = (uint)bVar18 * (int)auVar177._4_4_ | (uint)!bVar18 * auVar101._4_4_;
          bVar18 = (bool)((byte)(uVar79 >> 2) & 1);
          auVar129._8_4_ = (uint)bVar18 * (int)auVar177._8_4_ | (uint)!bVar18 * auVar101._8_4_;
          bVar18 = (bool)((byte)(uVar79 >> 3) & 1);
          auVar129._12_4_ = (uint)bVar18 * (int)auVar177._12_4_ | (uint)!bVar18 * auVar101._12_4_;
          auVar129._16_4_ = (uint)!(bool)((byte)(uVar79 >> 4) & 1) * auVar101._16_4_;
          auVar129._20_4_ = (uint)!(bool)((byte)(uVar79 >> 5) & 1) * auVar101._20_4_;
          auVar129._24_4_ = (uint)!(bool)((byte)(uVar79 >> 6) & 1) * auVar101._24_4_;
          auVar129._28_4_ = (uint)!SUB81(uVar79 >> 7,0) * auVar101._28_4_;
          bVar18 = (bool)((byte)(uVar79 >> 1) & 1);
          bVar20 = (bool)((byte)(uVar79 >> 2) & 1);
          bVar22 = (bool)((byte)(uVar79 >> 3) & 1);
          bVar19 = (bool)((byte)(uVar79 >> 1) & 1);
          bVar21 = (bool)((byte)(uVar79 >> 2) & 1);
          bVar23 = (bool)((byte)(uVar79 >> 3) & 1);
          auVar101 = vsubps_avx512vl(auVar129,auVar108);
          auVar95 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar154._12_4_ |
                                                  (uint)!bVar22 * auVar13._12_4_,
                                                  CONCAT48((uint)bVar20 * (int)auVar154._8_4_ |
                                                           (uint)!bVar20 * auVar13._8_4_,
                                                           CONCAT44((uint)bVar18 *
                                                                    (int)auVar154._4_4_ |
                                                                    (uint)!bVar18 * auVar13._4_4_,
                                                                    (uint)(bVar76 & 1) *
                                                                    (int)auVar154._0_4_ |
                                                                    (uint)!(bool)(bVar76 & 1) *
                                                                    auVar13._0_4_)))),auVar109);
          auVar96 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar23 * (int)auVar151._12_4_ |
                                                  (uint)!bVar23 * auVar86._12_4_,
                                                  CONCAT48((uint)bVar21 * (int)auVar151._8_4_ |
                                                           (uint)!bVar21 * auVar86._8_4_,
                                                           CONCAT44((uint)bVar19 *
                                                                    (int)auVar151._4_4_ |
                                                                    (uint)!bVar19 * auVar86._4_4_,
                                                                    (uint)(bVar76 & 1) *
                                                                    (int)auVar151._0_4_ |
                                                                    (uint)!(bool)(bVar76 & 1) *
                                                                    auVar86._0_4_)))),auVar125);
          auVar97 = vsubps_avx(auVar108,auVar126);
          auVar98 = vsubps_avx(auVar109,auVar127);
          auVar100 = vsubps_avx(auVar125,auVar128);
          auVar65._4_4_ = auVar96._4_4_ * fVar133;
          auVar65._0_4_ = auVar96._0_4_ * fVar131;
          auVar65._8_4_ = auVar96._8_4_ * fVar135;
          auVar65._12_4_ = auVar96._12_4_ * fVar137;
          auVar65._16_4_ = auVar96._16_4_ * 0.0;
          auVar65._20_4_ = auVar96._20_4_ * 0.0;
          auVar65._24_4_ = auVar96._24_4_ * 0.0;
          auVar65._28_4_ = 0;
          auVar88 = vfmsub231ps_fma(auVar65,auVar125,auVar101);
          auVar162._0_4_ = fVar132 * auVar101._0_4_;
          auVar162._4_4_ = fVar134 * auVar101._4_4_;
          auVar162._8_4_ = fVar136 * auVar101._8_4_;
          auVar162._12_4_ = fVar138 * auVar101._12_4_;
          auVar162._16_4_ = auVar101._16_4_ * 0.0;
          auVar162._20_4_ = auVar101._20_4_ * 0.0;
          auVar162._24_4_ = auVar101._24_4_ * 0.0;
          auVar162._28_4_ = 0;
          auVar9 = vfmsub231ps_fma(auVar162,auVar108,auVar95);
          auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar103,ZEXT1632(auVar88));
          auVar166._0_4_ = auVar95._0_4_ * auVar125._0_4_;
          auVar166._4_4_ = auVar95._4_4_ * auVar125._4_4_;
          auVar166._8_4_ = auVar95._8_4_ * auVar125._8_4_;
          auVar166._12_4_ = auVar95._12_4_ * auVar125._12_4_;
          auVar166._16_4_ = auVar95._16_4_ * fVar146;
          auVar166._20_4_ = auVar95._20_4_ * fVar139;
          auVar166._24_4_ = auVar95._24_4_ * fVar144;
          auVar166._28_4_ = 0;
          auVar88 = vfmsub231ps_fma(auVar166,auVar109,auVar96);
          auVar102 = vfmadd231ps_avx512vl(auVar99,auVar103,ZEXT1632(auVar88));
          auVar99 = vmulps_avx512vl(auVar100,auVar126);
          auVar99 = vfmsub231ps_avx512vl(auVar99,auVar97,auVar128);
          auVar66._4_4_ = auVar98._4_4_ * auVar128._4_4_;
          auVar66._0_4_ = auVar98._0_4_ * auVar128._0_4_;
          auVar66._8_4_ = auVar98._8_4_ * auVar128._8_4_;
          auVar66._12_4_ = auVar98._12_4_ * auVar128._12_4_;
          auVar66._16_4_ = auVar98._16_4_ * fVar175;
          auVar66._20_4_ = auVar98._20_4_ * fVar153;
          auVar66._24_4_ = auVar98._24_4_ * fVar85;
          auVar66._28_4_ = iVar3;
          auVar88 = vfmsub231ps_fma(auVar66,auVar127,auVar100);
          auVar167._0_4_ = auVar127._0_4_ * auVar97._0_4_;
          auVar167._4_4_ = auVar127._4_4_ * auVar97._4_4_;
          auVar167._8_4_ = auVar127._8_4_ * auVar97._8_4_;
          auVar167._12_4_ = auVar127._12_4_ * auVar97._12_4_;
          auVar167._16_4_ = fVar145 * auVar97._16_4_;
          auVar167._20_4_ = fVar174 * auVar97._20_4_;
          auVar167._24_4_ = fVar173 * auVar97._24_4_;
          auVar167._28_4_ = 0;
          auVar9 = vfmsub231ps_fma(auVar167,auVar98,auVar126);
          auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar103,auVar99);
          auVar93 = vfmadd231ps_avx512vl(auVar99,auVar103,ZEXT1632(auVar88));
          auVar99 = vmaxps_avx(auVar102,auVar93);
          uVar141 = vcmpps_avx512vl(auVar99,auVar103,2);
          bVar84 = bVar84 & (byte)uVar141;
          auVar198 = ZEXT3264(local_4e0);
          if (bVar84 != 0) {
            auVar67._4_4_ = auVar100._4_4_ * auVar95._4_4_;
            auVar67._0_4_ = auVar100._0_4_ * auVar95._0_4_;
            auVar67._8_4_ = auVar100._8_4_ * auVar95._8_4_;
            auVar67._12_4_ = auVar100._12_4_ * auVar95._12_4_;
            auVar67._16_4_ = auVar100._16_4_ * auVar95._16_4_;
            auVar67._20_4_ = auVar100._20_4_ * auVar95._20_4_;
            auVar67._24_4_ = auVar100._24_4_ * auVar95._24_4_;
            auVar67._28_4_ = auVar99._28_4_;
            auVar10 = vfmsub231ps_fma(auVar67,auVar98,auVar96);
            auVar68._4_4_ = auVar96._4_4_ * auVar97._4_4_;
            auVar68._0_4_ = auVar96._0_4_ * auVar97._0_4_;
            auVar68._8_4_ = auVar96._8_4_ * auVar97._8_4_;
            auVar68._12_4_ = auVar96._12_4_ * auVar97._12_4_;
            auVar68._16_4_ = auVar96._16_4_ * auVar97._16_4_;
            auVar68._20_4_ = auVar96._20_4_ * auVar97._20_4_;
            auVar68._24_4_ = auVar96._24_4_ * auVar97._24_4_;
            auVar68._28_4_ = auVar96._28_4_;
            auVar9 = vfmsub231ps_fma(auVar68,auVar101,auVar100);
            auVar69._4_4_ = auVar98._4_4_ * auVar101._4_4_;
            auVar69._0_4_ = auVar98._0_4_ * auVar101._0_4_;
            auVar69._8_4_ = auVar98._8_4_ * auVar101._8_4_;
            auVar69._12_4_ = auVar98._12_4_ * auVar101._12_4_;
            auVar69._16_4_ = auVar98._16_4_ * auVar101._16_4_;
            auVar69._20_4_ = auVar98._20_4_ * auVar101._20_4_;
            auVar69._24_4_ = auVar98._24_4_ * auVar101._24_4_;
            auVar69._28_4_ = auVar98._28_4_;
            auVar13 = vfmsub231ps_fma(auVar69,auVar97,auVar95);
            auVar88 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar9),ZEXT1632(auVar13));
            auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar10),auVar103);
            auVar95 = vrcp14ps_avx512vl(auVar99);
            auVar97 = auVar197._0_32_;
            auVar96 = vfnmadd213ps_avx512vl(auVar95,auVar99,auVar97);
            auVar88 = vfmadd132ps_fma(auVar96,auVar95,auVar95);
            auVar70._4_4_ = auVar13._4_4_ * auVar125._4_4_;
            auVar70._0_4_ = auVar13._0_4_ * auVar125._0_4_;
            auVar70._8_4_ = auVar13._8_4_ * auVar125._8_4_;
            auVar70._12_4_ = auVar13._12_4_ * auVar125._12_4_;
            auVar70._16_4_ = fVar146 * 0.0;
            auVar70._20_4_ = fVar139 * 0.0;
            auVar70._24_4_ = fVar144 * 0.0;
            auVar70._28_4_ = iVar2;
            auVar9 = vfmadd231ps_fma(auVar70,auVar109,ZEXT1632(auVar9));
            auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar108,ZEXT1632(auVar10));
            fVar146 = auVar88._0_4_;
            fVar139 = auVar88._4_4_;
            fVar144 = auVar88._8_4_;
            fVar145 = auVar88._12_4_;
            local_3a0 = ZEXT1632(CONCAT412(auVar9._12_4_ * fVar145,
                                           CONCAT48(auVar9._8_4_ * fVar144,
                                                    CONCAT44(auVar9._4_4_ * fVar139,
                                                             auVar9._0_4_ * fVar146))));
            auVar74._4_4_ = uStack_43c;
            auVar74._0_4_ = local_440;
            auVar74._8_4_ = uStack_438;
            auVar74._12_4_ = uStack_434;
            auVar74._16_4_ = uStack_430;
            auVar74._20_4_ = uStack_42c;
            auVar74._24_4_ = uStack_428;
            auVar74._28_4_ = uStack_424;
            uVar141 = vcmpps_avx512vl(local_3a0,auVar74,0xd);
            uVar140 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar35._4_4_ = uVar140;
            auVar35._0_4_ = uVar140;
            auVar35._8_4_ = uVar140;
            auVar35._12_4_ = uVar140;
            auVar35._16_4_ = uVar140;
            auVar35._20_4_ = uVar140;
            auVar35._24_4_ = uVar140;
            auVar35._28_4_ = uVar140;
            uVar28 = vcmpps_avx512vl(local_3a0,auVar35,2);
            bVar84 = (byte)uVar141 & (byte)uVar28 & bVar84;
            if (bVar84 != 0) {
              uVar141 = vcmpps_avx512vl(auVar99,auVar103,4);
              bVar84 = bVar84 & (byte)uVar141;
              auVar189 = ZEXT3264(local_620);
              if (bVar84 != 0) {
                fVar174 = auVar102._0_4_ * fVar146;
                fVar173 = auVar102._4_4_ * fVar139;
                auVar71._4_4_ = fVar173;
                auVar71._0_4_ = fVar174;
                fVar175 = auVar102._8_4_ * fVar144;
                auVar71._8_4_ = fVar175;
                fVar85 = auVar102._12_4_ * fVar145;
                auVar71._12_4_ = fVar85;
                fVar153 = auVar102._16_4_ * 0.0;
                auVar71._16_4_ = fVar153;
                fVar131 = auVar102._20_4_ * 0.0;
                auVar71._20_4_ = fVar131;
                fVar132 = auVar102._24_4_ * 0.0;
                auVar71._24_4_ = fVar132;
                auVar71._28_4_ = auVar99._28_4_;
                auVar95 = vsubps_avx512vl(auVar97,auVar71);
                local_3e0._0_4_ =
                     (float)((uint)(bVar76 & 1) * (int)fVar174 |
                            (uint)!(bool)(bVar76 & 1) * auVar95._0_4_);
                bVar18 = (bool)((byte)(uVar79 >> 1) & 1);
                local_3e0._4_4_ =
                     (float)((uint)bVar18 * (int)fVar173 | (uint)!bVar18 * auVar95._4_4_);
                bVar18 = (bool)((byte)(uVar79 >> 2) & 1);
                local_3e0._8_4_ =
                     (float)((uint)bVar18 * (int)fVar175 | (uint)!bVar18 * auVar95._8_4_);
                bVar18 = (bool)((byte)(uVar79 >> 3) & 1);
                local_3e0._12_4_ =
                     (float)((uint)bVar18 * (int)fVar85 | (uint)!bVar18 * auVar95._12_4_);
                bVar18 = (bool)((byte)(uVar79 >> 4) & 1);
                local_3e0._16_4_ =
                     (float)((uint)bVar18 * (int)fVar153 | (uint)!bVar18 * auVar95._16_4_);
                bVar18 = (bool)((byte)(uVar79 >> 5) & 1);
                local_3e0._20_4_ =
                     (float)((uint)bVar18 * (int)fVar131 | (uint)!bVar18 * auVar95._20_4_);
                bVar18 = (bool)((byte)(uVar79 >> 6) & 1);
                local_3e0._24_4_ =
                     (float)((uint)bVar18 * (int)fVar132 | (uint)!bVar18 * auVar95._24_4_);
                bVar18 = SUB81(uVar79 >> 7,0);
                local_3e0._28_4_ =
                     (float)((uint)bVar18 * auVar99._28_4_ | (uint)!bVar18 * auVar95._28_4_);
                auVar99 = vsubps_avx(ZEXT1632(auVar87),auVar94);
                auVar88 = vfmadd213ps_fma(auVar99,local_3e0,auVar94);
                uVar140 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
                auVar36._4_4_ = uVar140;
                auVar36._0_4_ = uVar140;
                auVar36._8_4_ = uVar140;
                auVar36._12_4_ = uVar140;
                auVar36._16_4_ = uVar140;
                auVar36._20_4_ = uVar140;
                auVar36._24_4_ = uVar140;
                auVar36._28_4_ = uVar140;
                auVar99 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar88._12_4_ + auVar88._12_4_,
                                                             CONCAT48(auVar88._8_4_ + auVar88._8_4_,
                                                                      CONCAT44(auVar88._4_4_ +
                                                                               auVar88._4_4_,
                                                                               auVar88._0_4_ +
                                                                               auVar88._0_4_)))),
                                          auVar36);
                uVar141 = vcmpps_avx512vl(local_3a0,auVar99,6);
                if (((byte)uVar141 & bVar84) != 0) {
                  auVar149._0_4_ = auVar93._0_4_ * fVar146;
                  auVar149._4_4_ = auVar93._4_4_ * fVar139;
                  auVar149._8_4_ = auVar93._8_4_ * fVar144;
                  auVar149._12_4_ = auVar93._12_4_ * fVar145;
                  auVar149._16_4_ = auVar93._16_4_ * 0.0;
                  auVar149._20_4_ = auVar93._20_4_ * 0.0;
                  auVar149._24_4_ = auVar93._24_4_ * 0.0;
                  auVar149._28_4_ = 0;
                  auVar99 = vsubps_avx512vl(auVar97,auVar149);
                  auVar130._0_4_ =
                       (uint)(bVar76 & 1) * (int)auVar149._0_4_ |
                       (uint)!(bool)(bVar76 & 1) * auVar99._0_4_;
                  bVar18 = (bool)((byte)(uVar79 >> 1) & 1);
                  auVar130._4_4_ =
                       (uint)bVar18 * (int)auVar149._4_4_ | (uint)!bVar18 * auVar99._4_4_;
                  bVar18 = (bool)((byte)(uVar79 >> 2) & 1);
                  auVar130._8_4_ =
                       (uint)bVar18 * (int)auVar149._8_4_ | (uint)!bVar18 * auVar99._8_4_;
                  bVar18 = (bool)((byte)(uVar79 >> 3) & 1);
                  auVar130._12_4_ =
                       (uint)bVar18 * (int)auVar149._12_4_ | (uint)!bVar18 * auVar99._12_4_;
                  bVar18 = (bool)((byte)(uVar79 >> 4) & 1);
                  auVar130._16_4_ =
                       (uint)bVar18 * (int)auVar149._16_4_ | (uint)!bVar18 * auVar99._16_4_;
                  bVar18 = (bool)((byte)(uVar79 >> 5) & 1);
                  auVar130._20_4_ =
                       (uint)bVar18 * (int)auVar149._20_4_ | (uint)!bVar18 * auVar99._20_4_;
                  bVar18 = (bool)((byte)(uVar79 >> 6) & 1);
                  auVar130._24_4_ =
                       (uint)bVar18 * (int)auVar149._24_4_ | (uint)!bVar18 * auVar99._24_4_;
                  auVar130._28_4_ = (uint)!SUB81(uVar79 >> 7,0) * auVar99._28_4_;
                  auVar37._8_4_ = 0x40000000;
                  auVar37._0_8_ = 0x4000000040000000;
                  auVar37._12_4_ = 0x40000000;
                  auVar37._16_4_ = 0x40000000;
                  auVar37._20_4_ = 0x40000000;
                  auVar37._24_4_ = 0x40000000;
                  auVar37._28_4_ = 0x40000000;
                  local_3c0 = vfmsub132ps_avx512vl(auVar130,auVar97,auVar37);
                  local_380 = (undefined4)lVar77;
                  pGVar16 = (context->scene->geometries).items[uVar14].ptr;
                  if ((pGVar16->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                    bVar76 = 0;
                  }
                  else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                          (bVar76 = 1, pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar88 = vcvtsi2ss_avx512f(auVar104._0_16_,local_380);
                    fVar146 = auVar88._0_4_;
                    local_320[0] = (fVar146 + local_3e0._0_4_ + 0.0) * local_460;
                    local_320[1] = (fVar146 + local_3e0._4_4_ + 1.0) * fStack_45c;
                    local_320[2] = (fVar146 + local_3e0._8_4_ + 2.0) * fStack_458;
                    local_320[3] = (fVar146 + local_3e0._12_4_ + 3.0) * fStack_454;
                    fStack_310 = (fVar146 + local_3e0._16_4_ + 4.0) * fStack_450;
                    fStack_30c = (fVar146 + local_3e0._20_4_ + 5.0) * fStack_44c;
                    fStack_308 = (fVar146 + local_3e0._24_4_ + 6.0) * fStack_448;
                    fStack_304 = fVar146 + local_3e0._28_4_ + 7.0;
                    local_300 = local_3c0;
                    local_2e0 = local_3a0;
                    uVar79 = 0;
                    uVar78 = (ulong)((byte)uVar141 & bVar84);
                    for (uVar81 = uVar78; local_37c = iVar15, local_370 = auVar26,
                        local_360 = uVar27, uStack_358 = uVar29, local_350 = uVar72,
                        uStack_348 = uVar73, (uVar81 & 1) == 0;
                        uVar81 = uVar81 >> 1 | 0x8000000000000000) {
                      uVar79 = uVar79 + 1;
                    }
                    while (auVar88 = auVar190._0_16_, uVar78 != 0) {
                      uVar140 = *(undefined4 *)(ray + k * 4 + 0x100);
                      fVar146 = local_320[uVar79];
                      auVar148._4_4_ = fVar146;
                      auVar148._0_4_ = fVar146;
                      auVar148._8_4_ = fVar146;
                      auVar148._12_4_ = fVar146;
                      local_220._16_4_ = fVar146;
                      local_220._0_16_ = auVar148;
                      local_220._20_4_ = fVar146;
                      local_220._24_4_ = fVar146;
                      local_220._28_4_ = fVar146;
                      local_200 = *(undefined4 *)(local_300 + uVar79 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2e0 + uVar79 * 4)
                      ;
                      local_650.context = context->user;
                      fVar139 = 1.0 - fVar146;
                      auVar10 = vfnmadd231ss_fma(ZEXT416((uint)(fVar146 * (fVar139 + fVar139))),
                                                 ZEXT416((uint)fVar139),ZEXT416((uint)fVar139));
                      auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar148,
                                                ZEXT416(0xc0a00000));
                      auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar146 * fVar146 * 3.0)),
                                                ZEXT416((uint)(fVar146 + fVar146)),auVar88);
                      auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar148,
                                                ZEXT416(0x40000000));
                      auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar139 * fVar139 * -3.0)),
                                                ZEXT416((uint)(fVar139 + fVar139)),auVar88);
                      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar146 * fVar146)),auVar148,
                                               ZEXT416((uint)(fVar139 * -2.0)));
                      fVar146 = auVar10._0_4_ * 0.5;
                      fVar139 = auVar87._0_4_ * 0.5;
                      fVar144 = auVar88._0_4_ * 0.5;
                      fVar145 = auVar9._0_4_ * 0.5;
                      auVar158._0_4_ = fVar145 * local_5f0;
                      auVar158._4_4_ = fVar145 * fStack_5ec;
                      auVar158._8_4_ = fVar145 * fStack_5e8;
                      auVar158._12_4_ = fVar145 * fStack_5e4;
                      auVar170._4_4_ = fVar144;
                      auVar170._0_4_ = fVar144;
                      auVar170._8_4_ = fVar144;
                      auVar170._12_4_ = fVar144;
                      auVar88 = vfmadd132ps_fma(auVar170,auVar158,auVar11);
                      auVar159._4_4_ = fVar139;
                      auVar159._0_4_ = fVar139;
                      auVar159._8_4_ = fVar139;
                      auVar159._12_4_ = fVar139;
                      auVar88 = vfmadd132ps_fma(auVar159,auVar88,auVar12);
                      auVar143._4_4_ = fVar146;
                      auVar143._0_4_ = fVar146;
                      auVar143._8_4_ = fVar146;
                      auVar143._12_4_ = fVar146;
                      auVar88 = vfmadd213ps_fma(auVar143,auVar26,auVar88);
                      local_280 = auVar88._0_4_;
                      auVar168._8_4_ = 1;
                      auVar168._0_8_ = 0x100000001;
                      auVar168._12_4_ = 1;
                      auVar168._16_4_ = 1;
                      auVar168._20_4_ = 1;
                      auVar168._24_4_ = 1;
                      auVar168._28_4_ = 1;
                      local_260 = vpermps_avx2(auVar168,ZEXT1632(auVar88));
                      auVar172._8_4_ = 2;
                      auVar172._0_8_ = 0x200000002;
                      auVar172._12_4_ = 2;
                      auVar172._16_4_ = 2;
                      auVar172._20_4_ = 2;
                      auVar172._24_4_ = 2;
                      auVar172._28_4_ = 2;
                      local_240 = vpermps_avx2(auVar172,ZEXT1632(auVar88));
                      uStack_27c = local_280;
                      uStack_278 = local_280;
                      uStack_274 = local_280;
                      uStack_270 = local_280;
                      uStack_26c = local_280;
                      uStack_268 = local_280;
                      uStack_264 = local_280;
                      uStack_1fc = local_200;
                      uStack_1f8 = local_200;
                      uStack_1f4 = local_200;
                      uStack_1f0 = local_200;
                      uStack_1ec = local_200;
                      uStack_1e8 = local_200;
                      uStack_1e4 = local_200;
                      local_1e0 = local_2a0._0_8_;
                      uStack_1d8 = local_2a0._8_8_;
                      uStack_1d0 = local_2a0._16_8_;
                      uStack_1c8 = local_2a0._24_8_;
                      local_1c0 = local_420;
                      vpcmpeqd_avx2(local_420,local_420);
                      local_1a0 = (local_650.context)->instID[0];
                      uStack_19c = local_1a0;
                      uStack_198 = local_1a0;
                      uStack_194 = local_1a0;
                      uStack_190 = local_1a0;
                      uStack_18c = local_1a0;
                      uStack_188 = local_1a0;
                      uStack_184 = local_1a0;
                      local_180 = (local_650.context)->instPrimID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_560 = local_2c0;
                      local_650.valid = (int *)local_560;
                      local_650.geometryUserPtr = pGVar16->userPtr;
                      local_650.hit = (RTCHitN *)&local_280;
                      local_650.N = 8;
                      local_480._0_8_ = uVar78;
                      local_650.ray = (RTCRayN *)ray;
                      if (pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar16->occlusionFilterN)(&local_650);
                        uVar78 = local_480._0_8_;
                      }
                      if (local_560 != (undefined1  [32])0x0) {
                        p_Var17 = context->args->filter;
                        if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar16->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var17)(&local_650);
                          uVar78 = local_480._0_8_;
                        }
                        auVar88 = auVar190._0_16_;
                        uVar81 = vptestmd_avx512vl(local_560,local_560);
                        auVar99 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar18 = (bool)((byte)uVar81 & 1);
                        bVar19 = (bool)((byte)(uVar81 >> 1) & 1);
                        bVar20 = (bool)((byte)(uVar81 >> 2) & 1);
                        bVar21 = (bool)((byte)(uVar81 >> 3) & 1);
                        bVar22 = (bool)((byte)(uVar81 >> 4) & 1);
                        bVar23 = (bool)((byte)(uVar81 >> 5) & 1);
                        bVar24 = (bool)((byte)(uVar81 >> 6) & 1);
                        bVar25 = SUB81(uVar81 >> 7,0);
                        *(uint *)(local_650.ray + 0x100) =
                             (uint)bVar18 * auVar99._0_4_ |
                             (uint)!bVar18 * *(int *)(local_650.ray + 0x100);
                        *(uint *)(local_650.ray + 0x104) =
                             (uint)bVar19 * auVar99._4_4_ |
                             (uint)!bVar19 * *(int *)(local_650.ray + 0x104);
                        *(uint *)(local_650.ray + 0x108) =
                             (uint)bVar20 * auVar99._8_4_ |
                             (uint)!bVar20 * *(int *)(local_650.ray + 0x108);
                        *(uint *)(local_650.ray + 0x10c) =
                             (uint)bVar21 * auVar99._12_4_ |
                             (uint)!bVar21 * *(int *)(local_650.ray + 0x10c);
                        *(uint *)(local_650.ray + 0x110) =
                             (uint)bVar22 * auVar99._16_4_ |
                             (uint)!bVar22 * *(int *)(local_650.ray + 0x110);
                        *(uint *)(local_650.ray + 0x114) =
                             (uint)bVar23 * auVar99._20_4_ |
                             (uint)!bVar23 * *(int *)(local_650.ray + 0x114);
                        *(uint *)(local_650.ray + 0x118) =
                             (uint)bVar24 * auVar99._24_4_ |
                             (uint)!bVar24 * *(int *)(local_650.ray + 0x118);
                        *(uint *)(local_650.ray + 0x11c) =
                             (uint)bVar25 * auVar99._28_4_ |
                             (uint)!bVar25 * *(int *)(local_650.ray + 0x11c);
                        if (local_560 != (undefined1  [32])0x0) {
                          bVar76 = 1;
                          goto LAB_01a597b3;
                        }
                      }
                      *(undefined4 *)(ray + k * 4 + 0x100) = uVar140;
                      uVar81 = uVar79 & 0x3f;
                      uVar79 = 0;
                      uVar78 = uVar78 ^ 1L << uVar81;
                      for (uVar81 = uVar78; (uVar81 & 1) == 0;
                          uVar81 = uVar81 >> 1 | 0x8000000000000000) {
                        uVar79 = uVar79 + 1;
                      }
                    }
                    bVar76 = 0;
LAB_01a597b3:
                    auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar197 = ZEXT3264(auVar99);
                    auVar88 = vxorps_avx512vl(auVar88,auVar88);
                    auVar190 = ZEXT1664(auVar88);
                    auVar191 = ZEXT3264(local_4a0);
                    auVar192 = ZEXT3264(local_4c0);
                    auVar193 = ZEXT3264(local_500);
                    auVar198 = ZEXT3264(local_4e0);
                    auVar189 = ZEXT3264(local_620);
                    auVar194 = ZEXT3264(local_5a0);
                    auVar195 = ZEXT3264(local_5c0);
                    auVar196 = ZEXT3264(local_5e0);
                  }
                  bVar80 = (bool)(bVar80 | bVar76);
                }
              }
              goto LAB_01a5979a;
            }
          }
          auVar189 = ZEXT3264(local_620);
        }
LAB_01a5979a:
      }
    }
    if (bVar80) break;
    uVar140 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar34._4_4_ = uVar140;
    auVar34._0_4_ = uVar140;
    auVar34._8_4_ = uVar140;
    auVar34._12_4_ = uVar140;
    auVar34._16_4_ = uVar140;
    auVar34._20_4_ = uVar140;
    auVar34._24_4_ = uVar140;
    auVar34._28_4_ = uVar140;
    uVar27 = vcmpps_avx512vl(local_80,auVar34,2);
    local_528 = (ulong)((uint)uVar83 & (uint)uVar27);
  }
  return local_528 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }